

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

void embree::sse2::CurveNiMBIntersector1<4>::
     intersect_t<embree::sse2::SweepCurve1Intersector1<embree::BezierCurveT>,embree::sse2::Intersect1Epilog1<true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  RTCRayQueryFlags *pRVar1;
  float *pfVar2;
  RTCRayQueryFlags *pRVar3;
  float *pfVar4;
  RTCRayQueryFlags *pRVar5;
  float *pfVar6;
  RTCRayQueryFlags *pRVar7;
  float *pfVar8;
  Primitive *pPVar9;
  undefined4 uVar10;
  undefined8 uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  undefined4 uVar18;
  Primitive PVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  Geometry *pGVar26;
  __int_type_conflict _Var27;
  long lVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  undefined1 auVar43 [15];
  undefined1 auVar44 [15];
  undefined1 auVar45 [15];
  undefined1 auVar46 [15];
  undefined1 auVar47 [15];
  undefined1 auVar48 [15];
  undefined1 auVar49 [15];
  undefined1 auVar50 [15];
  undefined1 auVar51 [15];
  undefined1 auVar52 [15];
  undefined1 auVar53 [15];
  undefined1 auVar54 [15];
  undefined1 auVar55 [15];
  undefined1 auVar56 [15];
  undefined1 auVar57 [15];
  undefined1 auVar58 [15];
  undefined1 auVar59 [15];
  undefined1 auVar60 [15];
  undefined1 auVar61 [15];
  undefined1 auVar62 [15];
  undefined1 auVar63 [15];
  undefined1 auVar64 [15];
  undefined1 auVar65 [15];
  undefined1 auVar66 [15];
  undefined1 auVar67 [15];
  undefined1 auVar68 [15];
  undefined1 auVar69 [15];
  undefined1 auVar70 [15];
  undefined1 auVar71 [15];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined6 uVar83;
  undefined1 auVar84 [12];
  unkbyte9 Var85;
  undefined1 auVar86 [13];
  undefined1 auVar87 [12];
  undefined1 auVar88 [13];
  undefined1 auVar89 [12];
  undefined1 auVar90 [12];
  undefined1 auVar91 [13];
  undefined1 auVar92 [12];
  undefined1 auVar93 [12];
  undefined1 auVar94 [13];
  undefined1 auVar95 [12];
  undefined1 auVar96 [12];
  undefined1 auVar97 [13];
  undefined1 auVar98 [12];
  undefined1 auVar99 [12];
  undefined1 auVar100 [12];
  undefined1 auVar101 [12];
  undefined1 auVar102 [12];
  undefined1 auVar103 [12];
  undefined1 auVar104 [12];
  undefined1 auVar105 [12];
  undefined1 auVar106 [12];
  undefined1 auVar107 [12];
  undefined1 auVar108 [15];
  undefined1 auVar109 [15];
  undefined1 auVar110 [15];
  undefined1 auVar111 [15];
  undefined1 auVar112 [15];
  undefined1 auVar113 [15];
  undefined1 auVar114 [15];
  undefined1 auVar115 [13];
  undefined1 auVar116 [15];
  vfloat_impl<4> vVar117;
  undefined4 uVar118;
  ulong uVar119;
  StackEntry *pSVar120;
  RTCRayN *pRVar121;
  RTCRayN *extraout_RAX;
  RTCRayN *extraout_RAX_00;
  undefined4 uVar123;
  RTCIntersectArguments *pRVar124;
  RTCIntersectArguments *pRVar125;
  RTCIntersectArguments *extraout_RDX;
  RTCIntersectArguments *extraout_RDX_00;
  RTCIntersectArguments *extraout_RDX_01;
  RTCIntersectArguments *pRVar126;
  RTCIntersectArguments *extraout_RDX_02;
  RTCIntersectArguments *extraout_RDX_03;
  RTCIntersectArguments *extraout_RDX_04;
  RTCIntersectArguments *pRVar127;
  RTCIntersectArguments *pRVar128;
  long lVar129;
  long lVar130;
  bool bVar131;
  uint uVar132;
  uint uVar133;
  uint uVar134;
  uint uVar135;
  uint uVar136;
  uint uVar137;
  char cVar138;
  short sVar139;
  float fVar140;
  char cVar173;
  undefined1 uVar174;
  undefined2 uVar175;
  float fVar177;
  undefined1 auVar141 [12];
  char cVar178;
  undefined1 auVar142 [16];
  float fVar179;
  float fVar180;
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar150 [16];
  undefined1 auVar153 [16];
  undefined1 auVar156 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  float pp;
  float fVar181;
  undefined1 auVar183 [12];
  undefined8 uVar182;
  undefined1 auVar185 [16];
  float fVar229;
  float fVar230;
  undefined1 auVar188 [16];
  undefined1 auVar191 [16];
  undefined1 auVar184 [12];
  undefined1 auVar195 [16];
  undefined1 auVar199 [16];
  undefined1 auVar202 [16];
  undefined1 auVar205 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  int iVar231;
  int iVar232;
  float fVar233;
  int iVar257;
  undefined1 auVar236 [16];
  undefined1 auVar240 [16];
  undefined1 auVar244 [16];
  float fVar258;
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  float fVar259;
  int iVar260;
  int iVar261;
  float fVar294;
  undefined1 auVar266 [16];
  undefined1 auVar270 [16];
  undefined1 auVar274 [16];
  float fVar295;
  undefined1 auVar277 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar296 [12];
  float fVar311;
  float fVar313;
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  float fVar312;
  float fVar314;
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar309 [16];
  float fVar315;
  float fVar328;
  float fVar330;
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  float fVar329;
  float fVar331;
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar325 [16];
  undefined1 auVar327 [16];
  float fVar332;
  float fVar340;
  float fVar342;
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  float fVar341;
  float fVar343;
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  float fVar344;
  float fVar345;
  float fVar349;
  float fVar350;
  float fVar351;
  float fVar352;
  float fVar353;
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  undefined1 auVar348 [16];
  float fVar362;
  undefined1 auVar354 [16];
  undefined1 auVar355 [16];
  undefined1 auVar356 [16];
  undefined1 auVar357 [16];
  undefined1 auVar358 [16];
  undefined1 auVar359 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar360;
  undefined1 auVar361 [16];
  float fVar363;
  float fVar364;
  float fVar366;
  float fVar367;
  float fVar368;
  float fVar369;
  float fVar370;
  undefined1 auVar365 [16];
  float fVar371;
  float fVar372;
  float fVar376;
  float fVar378;
  undefined1 auVar373 [16];
  float fVar377;
  float fVar379;
  float fVar380;
  undefined1 auVar374 [16];
  undefined1 auVar375 [16];
  float fVar381;
  float fVar383;
  float fVar391;
  float fVar394;
  vfloat4 a;
  undefined1 auVar384 [16];
  float fVar382;
  undefined1 auVar385 [16];
  float fVar392;
  float fVar395;
  float fVar397;
  undefined1 auVar386 [16];
  undefined1 auVar387 [16];
  float fVar393;
  float fVar396;
  float fVar398;
  undefined1 auVar388 [16];
  undefined1 auVar389 [16];
  undefined1 auVar390 [16];
  float fVar399;
  float fVar400;
  float fVar403;
  float fVar404;
  float fVar406;
  float fVar407;
  float fVar409;
  undefined1 auVar401 [16];
  float fVar405;
  float fVar408;
  float fVar410;
  undefined1 auVar402 [16];
  float fVar416;
  __m128 a_2;
  float fVar417;
  undefined1 auVar411 [16];
  undefined1 auVar412 [16];
  undefined1 auVar413 [16];
  undefined1 auVar414 [16];
  undefined1 auVar415 [16];
  float fVar418;
  float fVar419;
  float fVar420;
  float fVar426;
  float fVar427;
  float fVar428;
  float fVar429;
  float fVar430;
  float fVar431;
  float fVar432;
  float fVar433;
  undefined1 auVar421 [16];
  undefined1 auVar422 [16];
  undefined1 auVar423 [16];
  undefined1 auVar424 [16];
  undefined1 auVar425 [16];
  float fVar434;
  float fVar435;
  float fVar439;
  float fVar440;
  float fVar441;
  float fVar442;
  float fVar443;
  undefined1 auVar436 [16];
  undefined1 auVar437 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar438;
  float local_61c;
  undefined1 local_608 [8];
  float fStack_600;
  float fStack_5fc;
  undefined1 local_5f8 [8];
  float fStack_5f0;
  float fStack_5ec;
  undefined1 local_5b8 [8];
  float fStack_5b0;
  float fStack_5ac;
  short local_588;
  undefined2 uStack_586;
  undefined2 uStack_584;
  undefined2 uStack_582;
  RTCFilterFunctionNArguments args;
  int local_4fc;
  undefined1 local_4f8 [8];
  float fStack_4f0;
  float fStack_4ec;
  float local_4e8;
  float fStack_4e4;
  float fStack_4e0;
  float fStack_4dc;
  float local_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  undefined1 local_4c8 [8];
  float fStack_4c0;
  float fStack_4bc;
  vfloatx vu0;
  undefined8 local_3b8;
  undefined1 local_378 [16];
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  undefined1 local_358 [8];
  float fStack_350;
  float fStack_34c;
  undefined1 local_348 [8];
  float fStack_340;
  float fStack_33c;
  float local_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  undefined1 local_328 [16];
  Primitive *local_318;
  ulong local_310;
  float local_308;
  float fStack_304;
  float fStack_300;
  float fStack_2fc;
  float local_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  undefined1 local_2e8 [16];
  BBox<embree::vfloat_impl<4>_> tp1;
  float local_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float local_228;
  float fStack_224;
  float fStack_220;
  float fStack_21c;
  BBox<embree::vfloat_impl<4>_> tp0;
  float local_118 [4];
  undefined1 local_108 [16];
  StackEntry stack [4];
  ulong uVar122;
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar143 [16];
  int iVar176;
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar192 [16];
  undefined1 auVar196 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar193 [16];
  undefined1 auVar197 [16];
  undefined1 auVar194 [16];
  undefined1 auVar198 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar234 [12];
  undefined1 auVar235 [12];
  undefined1 auVar241 [16];
  undefined1 auVar245 [16];
  undefined1 auVar239 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar246 [16];
  undefined1 auVar262 [12];
  undefined1 auVar263 [12];
  undefined1 auVar264 [12];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar267 [16];
  undefined1 auVar271 [16];
  undefined1 auVar275 [16];
  undefined1 auVar265 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar276 [16];
  undefined1 auVar300 [16];
  undefined1 auVar308 [16];
  undefined1 auVar310 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar324 [16];
  undefined1 auVar326 [16];
  
  PVar19 = prim[1];
  uVar119 = (ulong)(byte)PVar19;
  lVar129 = uVar119 * 0x25;
  uVar118 = *(undefined4 *)(prim + uVar119 * 4 + 6);
  uVar20 = *(undefined4 *)(prim + uVar119 * 5 + 6);
  uVar21 = *(undefined4 *)(prim + uVar119 * 6 + 6);
  uVar123 = *(undefined4 *)(prim + uVar119 * 0xf + 6);
  uVar22 = *(undefined4 *)(prim + (ulong)(byte)PVar19 * 0x10 + 6);
  uVar23 = *(undefined4 *)(prim + uVar119 * 0x11 + 6);
  uVar24 = *(undefined4 *)(prim + uVar119 * 0x1a + 6);
  uVar25 = *(undefined4 *)(prim + uVar119 * 0x1b + 6);
  pPVar9 = prim + lVar129 + 6;
  fVar406 = *(float *)(pPVar9 + 0xc);
  fVar418 = ((ray->super_RayK<1>).org.field_0.m128[0] - *(float *)pPVar9) * fVar406;
  fVar426 = ((ray->super_RayK<1>).org.field_0.m128[1] - *(float *)(pPVar9 + 4)) * fVar406;
  fVar429 = ((ray->super_RayK<1>).org.field_0.m128[2] - *(float *)(pPVar9 + 8)) * fVar406;
  fVar399 = fVar406 * (ray->super_RayK<1>).dir.field_0.m128[0];
  fVar403 = fVar406 * (ray->super_RayK<1>).dir.field_0.m128[1];
  fVar406 = fVar406 * (ray->super_RayK<1>).dir.field_0.m128[2];
  uVar174 = (undefined1)((uint)uVar20 >> 0x18);
  uVar175 = CONCAT11(uVar174,uVar174);
  uVar174 = (undefined1)((uint)uVar20 >> 0x10);
  uVar182 = CONCAT35(CONCAT21(uVar175,uVar174),CONCAT14(uVar174,uVar20));
  cVar173 = (char)((uint)uVar20 >> 8);
  uVar83 = CONCAT51(CONCAT41((int)((ulong)uVar182 >> 0x20),cVar173),cVar173);
  cVar138 = (char)uVar20;
  uVar122 = CONCAT62(uVar83,CONCAT11(cVar138,cVar138));
  auVar238._8_4_ = 0;
  auVar238._0_8_ = uVar122;
  auVar238._12_2_ = uVar175;
  auVar238._14_2_ = uVar175;
  uVar175 = (undefined2)((ulong)uVar182 >> 0x20);
  auVar237._12_4_ = auVar238._12_4_;
  auVar237._8_2_ = 0;
  auVar237._0_8_ = uVar122;
  auVar237._10_2_ = uVar175;
  auVar236._10_6_ = auVar237._10_6_;
  auVar236._8_2_ = uVar175;
  auVar236._0_8_ = uVar122;
  uVar175 = (undefined2)uVar83;
  auVar84._4_8_ = auVar236._8_8_;
  auVar84._2_2_ = uVar175;
  auVar84._0_2_ = uVar175;
  iVar231 = (int)CONCAT11(cVar138,cVar138) >> 8;
  iVar257 = auVar84._0_4_ >> 0x18;
  auVar234._0_8_ = CONCAT44(iVar257,iVar231);
  auVar234._8_4_ = auVar236._8_4_ >> 0x18;
  auVar239._12_4_ = auVar237._12_4_ >> 0x18;
  auVar239._0_12_ = auVar234;
  fVar340 = (float)iVar257;
  cVar178 = cVar173 >> 7;
  auVar32[0xd] = 0;
  auVar32._0_13_ = auVar239._0_13_;
  auVar32[0xe] = cVar178;
  auVar37[0xc] = cVar178;
  auVar37._0_12_ = auVar234;
  auVar37._13_2_ = auVar32._13_2_;
  auVar42[0xb] = 0;
  auVar42._0_11_ = auVar234._0_11_;
  auVar42._12_3_ = auVar37._12_3_;
  auVar47[10] = cVar178;
  auVar47._0_10_ = auVar234._0_10_;
  auVar47._11_4_ = auVar42._11_4_;
  auVar52[9] = 0;
  auVar52._0_9_ = auVar234._0_9_;
  auVar52._10_5_ = auVar47._10_5_;
  auVar57[8] = cVar173;
  auVar57._0_8_ = auVar234._0_8_;
  auVar57._9_6_ = auVar52._9_6_;
  Var85 = CONCAT81(CONCAT71(auVar57._8_7_,(char)((uint)uVar21 >> 0x18)),(short)cVar138 >> 7);
  auVar62._6_9_ = Var85;
  auVar62[5] = (char)((uint)uVar21 >> 0x10);
  auVar62[4] = (undefined1)((short)cVar138 >> 7);
  auVar62._0_4_ = iVar231;
  cVar178 = (char)((uint)uVar21 >> 8);
  auVar86._2_11_ = auVar62._4_11_;
  auVar86[1] = cVar178;
  auVar86[0] = (undefined1)((short)cVar138 >> 7);
  cVar173 = (char)uVar21;
  auVar67._2_13_ = auVar86;
  auVar67._0_2_ = CONCAT11(cVar173,cVar138);
  uVar175 = (undefined2)Var85;
  auVar242._0_12_ = auVar67._0_12_;
  auVar242._12_2_ = uVar175;
  auVar242._14_2_ = uVar175;
  auVar241._12_4_ = auVar242._12_4_;
  auVar241._0_10_ = auVar67._0_10_;
  auVar241._10_2_ = auVar62._4_2_;
  auVar240._10_6_ = auVar241._10_6_;
  auVar240._0_8_ = auVar67._0_8_;
  auVar240._8_2_ = auVar62._4_2_;
  auVar87._4_8_ = auVar240._8_8_;
  auVar87._2_2_ = auVar86._0_2_;
  auVar87._0_2_ = auVar86._0_2_;
  iVar232 = (int)CONCAT11(cVar173,cVar138) >> 8;
  iVar257 = auVar87._0_4_ >> 0x18;
  auVar235._0_8_ = CONCAT44(iVar257,iVar232);
  auVar235._8_4_ = auVar240._8_4_ >> 0x18;
  auVar243._12_4_ = auVar241._12_4_ >> 0x18;
  auVar243._0_12_ = auVar235;
  fVar362 = (float)iVar257;
  cVar138 = cVar178 >> 7;
  auVar33[0xd] = 0;
  auVar33._0_13_ = auVar243._0_13_;
  auVar33[0xe] = cVar138;
  auVar38[0xc] = cVar138;
  auVar38._0_12_ = auVar235;
  auVar38._13_2_ = auVar33._13_2_;
  auVar43[0xb] = 0;
  auVar43._0_11_ = auVar235._0_11_;
  auVar43._12_3_ = auVar38._12_3_;
  auVar48[10] = cVar138;
  auVar48._0_10_ = auVar235._0_10_;
  auVar48._11_4_ = auVar43._11_4_;
  auVar53[9] = 0;
  auVar53._0_9_ = auVar235._0_9_;
  auVar53._10_5_ = auVar48._10_5_;
  auVar58[8] = cVar178;
  auVar58._0_8_ = auVar235._0_8_;
  auVar58._9_6_ = auVar53._9_6_;
  Var85 = CONCAT81(CONCAT71(auVar58._8_7_,(char)((uint)uVar22 >> 0x18)),(short)cVar173 >> 7);
  auVar63._6_9_ = Var85;
  auVar63[5] = (char)((uint)uVar22 >> 0x10);
  auVar63[4] = (undefined1)((short)cVar173 >> 7);
  auVar63._0_4_ = iVar232;
  auVar88._2_11_ = auVar63._4_11_;
  auVar88[1] = (char)((uint)uVar22 >> 8);
  auVar88[0] = (undefined1)((short)cVar173 >> 7);
  sVar139 = CONCAT11((char)uVar22,cVar173);
  auVar68._2_13_ = auVar88;
  auVar68._0_2_ = sVar139;
  uVar175 = (undefined2)Var85;
  auVar246._0_12_ = auVar68._0_12_;
  auVar246._12_2_ = uVar175;
  auVar246._14_2_ = uVar175;
  auVar245._12_4_ = auVar246._12_4_;
  auVar245._0_10_ = auVar68._0_10_;
  auVar245._10_2_ = auVar63._4_2_;
  auVar244._10_6_ = auVar245._10_6_;
  auVar244._0_8_ = auVar68._0_8_;
  auVar244._8_2_ = auVar63._4_2_;
  auVar89._4_8_ = auVar244._8_8_;
  auVar89._2_2_ = auVar88._0_2_;
  auVar89._0_2_ = auVar88._0_2_;
  fVar344 = (float)((int)sVar139 >> 8);
  fVar349 = (float)(auVar89._0_4_ >> 0x18);
  fVar351 = (float)(auVar244._8_4_ >> 0x18);
  uVar174 = (undefined1)((uint)uVar23 >> 0x18);
  uVar175 = CONCAT11(uVar174,uVar174);
  uVar174 = (undefined1)((uint)uVar23 >> 0x10);
  uVar182 = CONCAT35(CONCAT21(uVar175,uVar174),CONCAT14(uVar174,uVar23));
  uVar174 = (undefined1)((uint)uVar23 >> 8);
  uVar83 = CONCAT51(CONCAT41((int)((ulong)uVar182 >> 0x20),uVar174),uVar174);
  sVar139 = CONCAT11((char)uVar23,(char)uVar23);
  uVar122 = CONCAT62(uVar83,sVar139);
  auVar187._8_4_ = 0;
  auVar187._0_8_ = uVar122;
  auVar187._12_2_ = uVar175;
  auVar187._14_2_ = uVar175;
  uVar175 = (undefined2)((ulong)uVar182 >> 0x20);
  auVar186._12_4_ = auVar187._12_4_;
  auVar186._8_2_ = 0;
  auVar186._0_8_ = uVar122;
  auVar186._10_2_ = uVar175;
  auVar185._10_6_ = auVar186._10_6_;
  auVar185._8_2_ = uVar175;
  auVar185._0_8_ = uVar122;
  uVar175 = (undefined2)uVar83;
  auVar90._4_8_ = auVar185._8_8_;
  auVar90._2_2_ = uVar175;
  auVar90._0_2_ = uVar175;
  fVar363 = (float)((int)sVar139 >> 8);
  fVar366 = (float)(auVar90._0_4_ >> 0x18);
  fVar368 = (float)(auVar185._8_4_ >> 0x18);
  uVar20 = *(undefined4 *)(prim + uVar119 * 0x1c + 6);
  fVar259 = fVar406 * fVar363;
  fVar294 = fVar406 * fVar366;
  auVar262._0_8_ = CONCAT44(fVar294,fVar259);
  auVar262._8_4_ = fVar406 * fVar368;
  auVar265._12_4_ = fVar406 * (float)(auVar186._12_4_ >> 0x18);
  auVar265._0_12_ = auVar262;
  fVar233 = ((ray->super_RayK<1>).dir.field_0.m128[3] - *(float *)(prim + lVar129 + 0x16)) *
            *(float *)(prim + lVar129 + 0x1a);
  _local_4c8 = ZEXT416((uint)fVar233);
  auVar34[0xd] = 0;
  auVar34._0_13_ = auVar265._0_13_;
  auVar34[0xe] = (char)((uint)fVar294 >> 0x18);
  auVar39[0xc] = (char)((uint)fVar294 >> 0x10);
  auVar39._0_12_ = auVar262;
  auVar39._13_2_ = auVar34._13_2_;
  auVar44[0xb] = 0;
  auVar44._0_11_ = auVar262._0_11_;
  auVar44._12_3_ = auVar39._12_3_;
  auVar49[10] = (char)((uint)fVar294 >> 8);
  auVar49._0_10_ = auVar262._0_10_;
  auVar49._11_4_ = auVar44._11_4_;
  auVar54[9] = 0;
  auVar54._0_9_ = auVar262._0_9_;
  auVar54._10_5_ = auVar49._10_5_;
  auVar59[8] = SUB41(fVar294,0);
  auVar59._0_8_ = auVar262._0_8_;
  auVar59._9_6_ = auVar54._9_6_;
  Var85 = CONCAT81(CONCAT71(auVar59._8_7_,(char)((uint)uVar118 >> 0x18)),
                   (char)((uint)fVar259 >> 0x18));
  auVar64._6_9_ = Var85;
  auVar64[5] = (char)((uint)uVar118 >> 0x10);
  auVar64[4] = (char)((uint)fVar259 >> 0x10);
  auVar64._0_4_ = fVar259;
  cVar178 = (char)((uint)uVar118 >> 8);
  auVar91._2_11_ = auVar64._4_11_;
  auVar91[1] = cVar178;
  auVar91[0] = (char)((uint)fVar259 >> 8);
  cVar173 = (char)uVar118;
  sVar139 = CONCAT11(cVar173,SUB41(fVar259,0));
  auVar69._2_13_ = auVar91;
  auVar69._0_2_ = sVar139;
  uVar175 = (undefined2)Var85;
  auVar268._0_12_ = auVar69._0_12_;
  auVar268._12_2_ = uVar175;
  auVar268._14_2_ = uVar175;
  auVar267._12_4_ = auVar268._12_4_;
  auVar267._0_10_ = auVar69._0_10_;
  auVar267._10_2_ = auVar64._4_2_;
  auVar266._10_6_ = auVar267._10_6_;
  auVar266._0_8_ = auVar69._0_8_;
  auVar266._8_2_ = auVar64._4_2_;
  auVar92._4_8_ = auVar266._8_8_;
  auVar92._2_2_ = auVar91._0_2_;
  auVar92._0_2_ = auVar91._0_2_;
  iVar260 = (int)sVar139 >> 8;
  iVar257 = auVar92._0_4_ >> 0x18;
  auVar263._0_8_ = CONCAT44(iVar257,iVar260);
  auVar263._8_4_ = auVar266._8_4_ >> 0x18;
  auVar269._12_4_ = auVar267._12_4_ >> 0x18;
  auVar269._0_12_ = auVar263;
  fVar328 = (float)iVar257;
  local_5f8[0] = (char)uVar123;
  local_5f8[1] = (char)((uint)uVar123 >> 8);
  local_5f8[2] = (undefined1)((uint)uVar123 >> 0x10);
  local_5f8[3] = (undefined1)((uint)uVar123 >> 0x18);
  cVar138 = cVar178 >> 7;
  auVar108[0xd] = 0;
  auVar108._0_13_ = auVar269._0_13_;
  auVar108[0xe] = cVar138;
  auVar109[0xc] = cVar138;
  auVar109._0_12_ = auVar263;
  auVar109._13_2_ = auVar108._13_2_;
  auVar110[0xb] = 0;
  auVar110._0_11_ = auVar263._0_11_;
  auVar110._12_3_ = auVar109._12_3_;
  auVar111[10] = cVar138;
  auVar111._0_10_ = auVar263._0_10_;
  auVar111._11_4_ = auVar110._11_4_;
  auVar112[9] = 0;
  auVar112._0_9_ = auVar263._0_9_;
  auVar112._10_5_ = auVar111._10_5_;
  auVar113[8] = cVar178;
  auVar113._0_8_ = auVar263._0_8_;
  auVar113._9_6_ = auVar112._9_6_;
  Var85 = CONCAT81(CONCAT71(auVar113._8_7_,local_5f8[3]),(short)cVar173 >> 7);
  auVar114._6_9_ = Var85;
  auVar114[5] = local_5f8[2];
  auVar114[4] = (undefined1)((short)cVar173 >> 7);
  auVar114._0_4_ = iVar260;
  auVar115._2_11_ = auVar114._4_11_;
  auVar115[1] = local_5f8[1];
  auVar115[0] = (undefined1)((short)cVar173 >> 7);
  auVar116._2_13_ = auVar115;
  auVar116._0_2_ = CONCAT11(local_5f8[0],cVar173);
  uVar175 = (undefined2)Var85;
  auVar272._0_12_ = auVar116._0_12_;
  auVar272._12_2_ = uVar175;
  auVar272._14_2_ = uVar175;
  auVar271._12_4_ = auVar272._12_4_;
  auVar271._0_10_ = auVar116._0_10_;
  auVar271._10_2_ = auVar114._4_2_;
  auVar270._10_6_ = auVar271._10_6_;
  auVar270._0_8_ = auVar116._0_8_;
  auVar270._8_2_ = auVar114._4_2_;
  auVar93._4_8_ = auVar270._8_8_;
  auVar93._2_2_ = auVar115._0_2_;
  auVar93._0_2_ = auVar115._0_2_;
  iVar261 = (int)CONCAT11(local_5f8[0],cVar173) >> 8;
  iVar257 = auVar93._0_4_ >> 0x18;
  auVar264._0_8_ = CONCAT44(iVar257,iVar261);
  auVar264._8_4_ = auVar270._8_4_ >> 0x18;
  auVar273._12_4_ = auVar271._12_4_ >> 0x18;
  auVar273._0_12_ = auVar264;
  fVar258 = (float)iVar257;
  cVar138 = local_5f8[1] >> 7;
  auVar35[0xd] = 0;
  auVar35._0_13_ = auVar273._0_13_;
  auVar35[0xe] = cVar138;
  auVar40[0xc] = cVar138;
  auVar40._0_12_ = auVar264;
  auVar40._13_2_ = auVar35._13_2_;
  auVar45[0xb] = 0;
  auVar45._0_11_ = auVar264._0_11_;
  auVar45._12_3_ = auVar40._12_3_;
  auVar50[10] = cVar138;
  auVar50._0_10_ = auVar264._0_10_;
  auVar50._11_4_ = auVar45._11_4_;
  auVar55[9] = 0;
  auVar55._0_9_ = auVar264._0_9_;
  auVar55._10_5_ = auVar50._10_5_;
  auVar60[8] = local_5f8[1];
  auVar60._0_8_ = auVar264._0_8_;
  auVar60._9_6_ = auVar55._9_6_;
  Var85 = CONCAT81(CONCAT71(auVar60._8_7_,(char)((uint)uVar24 >> 0x18)),(short)local_5f8[0] >> 7);
  auVar65._6_9_ = Var85;
  auVar65[5] = (char)((uint)uVar24 >> 0x10);
  auVar65[4] = (undefined1)((short)local_5f8[0] >> 7);
  auVar65._0_4_ = iVar261;
  auVar94._2_11_ = auVar65._4_11_;
  auVar94[1] = (char)((uint)uVar24 >> 8);
  auVar94[0] = (undefined1)((short)local_5f8[0] >> 7);
  sVar139 = CONCAT11((char)uVar24,local_5f8[0]);
  auVar70._2_13_ = auVar94;
  auVar70._0_2_ = sVar139;
  uVar175 = (undefined2)Var85;
  auVar276._0_12_ = auVar70._0_12_;
  auVar276._12_2_ = uVar175;
  auVar276._14_2_ = uVar175;
  auVar275._12_4_ = auVar276._12_4_;
  auVar275._0_10_ = auVar70._0_10_;
  auVar275._10_2_ = auVar65._4_2_;
  auVar274._10_6_ = auVar275._10_6_;
  auVar274._0_8_ = auVar70._0_8_;
  auVar274._8_2_ = auVar65._4_2_;
  auVar95._4_8_ = auVar274._8_8_;
  auVar95._2_2_ = auVar94._0_2_;
  auVar95._0_2_ = auVar94._0_2_;
  fVar371 = (float)((int)sVar139 >> 8);
  fVar376 = (float)(auVar95._0_4_ >> 0x18);
  fVar378 = (float)(auVar274._8_4_ >> 0x18);
  uVar174 = (undefined1)((uint)uVar25 >> 0x18);
  uVar175 = CONCAT11(uVar174,uVar174);
  uVar174 = (undefined1)((uint)uVar25 >> 0x10);
  uVar182 = CONCAT35(CONCAT21(uVar175,uVar174),CONCAT14(uVar174,uVar25));
  cVar173 = (char)((uint)uVar25 >> 8);
  uVar83 = CONCAT51(CONCAT41((int)((ulong)uVar182 >> 0x20),cVar173),cVar173);
  cVar138 = (char)uVar25;
  uVar122 = CONCAT62(uVar83,CONCAT11(cVar138,cVar138));
  auVar333._8_4_ = 0;
  auVar333._0_8_ = uVar122;
  auVar333._12_2_ = uVar175;
  auVar333._14_2_ = uVar175;
  uVar175 = (undefined2)((ulong)uVar182 >> 0x20);
  auVar248._12_4_ = auVar333._12_4_;
  auVar248._8_2_ = 0;
  auVar248._0_8_ = uVar122;
  auVar248._10_2_ = uVar175;
  auVar356._10_6_ = auVar248._10_6_;
  auVar356._8_2_ = uVar175;
  auVar356._0_8_ = uVar122;
  uVar175 = (undefined2)uVar83;
  auVar96._4_8_ = auVar356._8_8_;
  auVar96._2_2_ = uVar175;
  auVar96._0_2_ = uVar175;
  iVar257 = (int)CONCAT11(cVar138,cVar138) >> 8;
  iVar176 = auVar96._0_4_ >> 0x18;
  auVar141._0_8_ = CONCAT44(iVar176,iVar257);
  auVar141._8_4_ = auVar356._8_4_ >> 0x18;
  auVar387._12_4_ = auVar248._12_4_ >> 0x18;
  auVar387._0_12_ = auVar141;
  fVar295 = (float)iVar176;
  cVar178 = cVar173 >> 7;
  auVar36[0xd] = 0;
  auVar36._0_13_ = auVar387._0_13_;
  auVar36[0xe] = cVar178;
  auVar41[0xc] = cVar178;
  auVar41._0_12_ = auVar141;
  auVar41._13_2_ = auVar36._13_2_;
  auVar46[0xb] = 0;
  auVar46._0_11_ = auVar141._0_11_;
  auVar46._12_3_ = auVar41._12_3_;
  auVar51[10] = cVar178;
  auVar51._0_10_ = auVar141._0_10_;
  auVar51._11_4_ = auVar46._11_4_;
  auVar56[9] = 0;
  auVar56._0_9_ = auVar141._0_9_;
  auVar56._10_5_ = auVar51._10_5_;
  auVar61[8] = cVar173;
  auVar61._0_8_ = auVar141._0_8_;
  auVar61._9_6_ = auVar56._9_6_;
  Var85 = CONCAT81(CONCAT71(auVar61._8_7_,(char)((uint)uVar20 >> 0x18)),(short)cVar138 >> 7);
  auVar66._6_9_ = Var85;
  auVar66[5] = (char)((uint)uVar20 >> 0x10);
  auVar66[4] = (undefined1)((short)cVar138 >> 7);
  auVar66._0_4_ = iVar257;
  auVar97._2_11_ = auVar66._4_11_;
  auVar97[1] = (char)((uint)uVar20 >> 8);
  auVar97[0] = (undefined1)((short)cVar138 >> 7);
  sVar139 = CONCAT11((char)uVar20,cVar138);
  auVar71._2_13_ = auVar97;
  auVar71._0_2_ = sVar139;
  uVar175 = (undefined2)Var85;
  auVar437._0_12_ = auVar71._0_12_;
  auVar437._12_2_ = uVar175;
  auVar437._14_2_ = uVar175;
  auVar143._12_4_ = auVar437._12_4_;
  auVar143._0_10_ = auVar71._0_10_;
  auVar143._10_2_ = auVar66._4_2_;
  auVar142._10_6_ = auVar143._10_6_;
  auVar142._0_8_ = auVar71._0_8_;
  auVar142._8_2_ = auVar66._4_2_;
  auVar98._4_8_ = auVar142._8_8_;
  auVar98._2_2_ = auVar97._0_2_;
  auVar98._0_2_ = auVar97._0_2_;
  fVar181 = (float)((int)sVar139 >> 8);
  fVar229 = (float)(auVar98._0_4_ >> 0x18);
  fVar230 = (float)(auVar142._8_4_ >> 0x18);
  fVar140 = fVar399 * (float)iVar260 + fVar403 * (float)iVar231 + fVar406 * (float)iVar232;
  fVar177 = fVar399 * fVar328 + fVar403 * fVar340 + fVar406 * fVar362;
  fVar179 = fVar399 * (float)auVar263._8_4_ +
            fVar403 * (float)auVar234._8_4_ + fVar406 * (float)auVar235._8_4_;
  fVar180 = fVar399 * (float)auVar269._12_4_ +
            fVar403 * (float)auVar239._12_4_ + fVar406 * (float)auVar243._12_4_;
  fVar259 = fVar399 * (float)iVar261 + fVar403 * fVar344 + fVar259;
  fVar294 = fVar399 * fVar258 + fVar403 * fVar349 + fVar294;
  fVar311 = fVar399 * (float)auVar264._8_4_ + fVar403 * fVar351 + auVar262._8_4_;
  fVar313 = fVar399 * (float)auVar273._12_4_ +
            fVar403 * (float)(auVar245._12_4_ >> 0x18) + auVar265._12_4_;
  fVar381 = fVar399 * fVar371 + fVar403 * (float)iVar257 + fVar406 * fVar181;
  fVar391 = fVar399 * fVar376 + fVar403 * fVar295 + fVar406 * fVar229;
  fVar394 = fVar399 * fVar378 + fVar403 * (float)auVar141._8_4_ + fVar406 * fVar230;
  fVar399 = fVar399 * (float)(auVar275._12_4_ >> 0x18) +
            fVar403 * (float)auVar387._12_4_ + fVar406 * (float)(auVar143._12_4_ >> 0x18);
  uVar122 = *(ulong *)(prim + uVar119 * 7 + 6);
  uVar182 = *(undefined8 *)(prim + uVar119 * 0xb + 6);
  uVar11 = *(undefined8 *)(prim + uVar119 * 9 + 6);
  local_588 = (short)uVar11;
  uStack_586 = (undefined2)((ulong)uVar11 >> 0x10);
  uStack_584 = (undefined2)((ulong)uVar11 >> 0x20);
  uStack_582 = (undefined2)((ulong)uVar11 >> 0x30);
  uVar12 = *(ulong *)(prim + uVar119 * 0xd + 6);
  fVar403 = (float)iVar260 * fVar418 + (float)iVar231 * fVar426 + (float)iVar232 * fVar429;
  fVar404 = fVar328 * fVar418 + fVar340 * fVar426 + fVar362 * fVar429;
  fVar407 = (float)auVar263._8_4_ * fVar418 +
            (float)auVar234._8_4_ * fVar426 + (float)auVar235._8_4_ * fVar429;
  fVar409 = (float)auVar269._12_4_ * fVar418 +
            (float)auVar239._12_4_ * fVar426 + (float)auVar243._12_4_ * fVar429;
  fVar328 = (float)iVar261 * fVar418 + fVar344 * fVar426 + fVar363 * fVar429;
  fVar340 = fVar258 * fVar418 + fVar349 * fVar426 + fVar366 * fVar429;
  fVar344 = (float)auVar264._8_4_ * fVar418 + fVar351 * fVar426 + fVar368 * fVar429;
  fVar349 = (float)auVar273._12_4_ * fVar418 +
            (float)(auVar245._12_4_ >> 0x18) * fVar426 + (float)(auVar186._12_4_ >> 0x18) * fVar429;
  fVar434 = fVar418 * fVar371 + fVar426 * (float)iVar257 + fVar429 * fVar181;
  fVar439 = fVar418 * fVar376 + fVar426 * fVar295 + fVar429 * fVar229;
  fVar441 = fVar418 * fVar378 + fVar426 * (float)auVar141._8_4_ + fVar429 * fVar230;
  fVar418 = fVar418 * (float)(auVar275._12_4_ >> 0x18) +
            fVar426 * (float)auVar387._12_4_ + fVar429 * (float)(auVar143._12_4_ >> 0x18);
  fVar406 = (float)DAT_01f4bd50;
  fVar181 = DAT_01f4bd50._4_4_;
  fVar229 = DAT_01f4bd50._8_4_;
  fVar230 = DAT_01f4bd50._12_4_;
  uVar132 = -(uint)(fVar406 <= ABS(fVar140));
  uVar133 = -(uint)(fVar181 <= ABS(fVar177));
  uVar134 = -(uint)(fVar229 <= ABS(fVar179));
  uVar136 = -(uint)(fVar230 <= ABS(fVar180));
  auVar144._0_4_ = (uint)fVar140 & uVar132;
  auVar144._4_4_ = (uint)fVar177 & uVar133;
  auVar144._8_4_ = (uint)fVar179 & uVar134;
  auVar144._12_4_ = (uint)fVar180 & uVar136;
  auVar316._0_4_ = ~uVar132 & (uint)fVar406;
  auVar316._4_4_ = ~uVar133 & (uint)fVar181;
  auVar316._8_4_ = ~uVar134 & (uint)fVar229;
  auVar316._12_4_ = ~uVar136 & (uint)fVar230;
  auVar316 = auVar316 | auVar144;
  uVar132 = -(uint)(fVar406 <= ABS(fVar259));
  uVar133 = -(uint)(fVar181 <= ABS(fVar294));
  uVar134 = -(uint)(fVar229 <= ABS(fVar311));
  uVar136 = -(uint)(fVar230 <= ABS(fVar313));
  auVar297._0_4_ = (uint)fVar259 & uVar132;
  auVar297._4_4_ = (uint)fVar294 & uVar133;
  auVar297._8_4_ = (uint)fVar311 & uVar134;
  auVar297._12_4_ = (uint)fVar313 & uVar136;
  auVar145._0_4_ = ~uVar132 & (uint)fVar406;
  auVar145._4_4_ = ~uVar133 & (uint)fVar181;
  auVar145._8_4_ = ~uVar134 & (uint)fVar229;
  auVar145._12_4_ = ~uVar136 & (uint)fVar230;
  auVar145 = auVar145 | auVar297;
  uVar132 = -(uint)(fVar406 <= ABS(fVar381));
  uVar133 = -(uint)(fVar181 <= ABS(fVar391));
  uVar134 = -(uint)(fVar229 <= ABS(fVar394));
  uVar136 = -(uint)(fVar230 <= ABS(fVar399));
  auVar384._0_4_ = (uint)fVar381 & uVar132;
  auVar384._4_4_ = (uint)fVar391 & uVar133;
  auVar384._8_4_ = (uint)fVar394 & uVar134;
  auVar384._12_4_ = (uint)fVar399 & uVar136;
  auVar298._0_4_ = ~uVar132 & (uint)fVar406;
  auVar298._4_4_ = ~uVar133 & (uint)fVar181;
  auVar298._8_4_ = ~uVar134 & (uint)fVar229;
  auVar298._12_4_ = ~uVar136 & (uint)fVar230;
  auVar298 = auVar298 | auVar384;
  auVar333 = rcpps(_DAT_01f4bd50,auVar316);
  fVar368 = auVar333._0_4_;
  auVar317._0_4_ = auVar316._0_4_ * fVar368;
  fVar371 = auVar333._4_4_;
  auVar317._4_4_ = auVar316._4_4_ * fVar371;
  fVar376 = auVar333._8_4_;
  auVar317._8_4_ = auVar316._8_4_ * fVar376;
  fVar378 = auVar333._12_4_;
  auVar317._12_4_ = auVar316._12_4_ * fVar378;
  fVar368 = (1.0 - auVar317._0_4_) * fVar368 + fVar368;
  fVar371 = (1.0 - auVar317._4_4_) * fVar371 + fVar371;
  fVar376 = (1.0 - auVar317._8_4_) * fVar376 + fVar376;
  fVar378 = (1.0 - auVar317._12_4_) * fVar378 + fVar378;
  auVar333 = rcpps(auVar317,auVar145);
  fVar351 = auVar333._0_4_;
  auVar146._0_4_ = auVar145._0_4_ * fVar351;
  fVar362 = auVar333._4_4_;
  auVar146._4_4_ = auVar145._4_4_ * fVar362;
  fVar363 = auVar333._8_4_;
  auVar146._8_4_ = auVar145._8_4_ * fVar363;
  fVar366 = auVar333._12_4_;
  auVar146._12_4_ = auVar145._12_4_ * fVar366;
  fVar351 = (1.0 - auVar146._0_4_) * fVar351 + fVar351;
  fVar362 = (1.0 - auVar146._4_4_) * fVar362 + fVar362;
  fVar363 = (1.0 - auVar146._8_4_) * fVar363 + fVar363;
  fVar366 = (1.0 - auVar146._12_4_) * fVar366 + fVar366;
  auVar333 = rcpps(auVar146,auVar298);
  fVar406 = auVar333._0_4_;
  auVar299._0_4_ = auVar298._0_4_ * fVar406;
  fVar140 = auVar333._4_4_;
  fVar177 = auVar298._4_4_ * fVar140;
  auVar296._0_8_ = CONCAT44(fVar177,auVar299._0_4_);
  fVar181 = auVar333._8_4_;
  auVar296._8_4_ = auVar298._8_4_ * fVar181;
  fVar259 = auVar333._12_4_;
  uVar11 = *(undefined8 *)(prim + uVar119 * 0x12 + 6);
  fVar406 = (1.0 - auVar299._0_4_) * fVar406 + fVar406;
  fVar140 = (1.0 - fVar177) * fVar140 + fVar140;
  fVar181 = (1.0 - auVar296._8_4_) * fVar181 + fVar181;
  fVar259 = (1.0 - auVar298._12_4_ * fVar259) * fVar259 + fVar259;
  uVar13 = *(ulong *)(prim + uVar119 * 0x16 + 6);
  uVar175 = (undefined2)(uVar122 >> 0x30);
  auVar190._8_4_ = 0;
  auVar190._0_8_ = uVar122;
  auVar190._12_2_ = uVar175;
  auVar190._14_2_ = uVar175;
  uVar175 = (undefined2)(uVar122 >> 0x20);
  auVar189._12_4_ = auVar190._12_4_;
  auVar189._8_2_ = 0;
  auVar189._0_8_ = uVar122;
  auVar189._10_2_ = uVar175;
  auVar188._10_6_ = auVar189._10_6_;
  auVar188._8_2_ = uVar175;
  auVar188._0_8_ = uVar122;
  uVar175 = (undefined2)(uVar122 >> 0x10);
  auVar99._4_8_ = auVar188._8_8_;
  auVar99._2_2_ = uVar175;
  auVar99._0_2_ = uVar175;
  auVar191._0_4_ = (float)(int)(short)uVar122;
  fVar294 = (float)(auVar99._0_4_ >> 0x10);
  auVar183._0_8_ = CONCAT44(fVar294,auVar191._0_4_);
  auVar183._8_4_ = (float)(auVar188._8_4_ >> 0x10);
  auVar302._12_2_ = (short)((uint)fVar177 >> 0x10);
  auVar302._0_12_ = auVar296;
  auVar302._14_2_ = (short)((ulong)uVar182 >> 0x30);
  auVar301._12_4_ = auVar302._12_4_;
  auVar301._0_10_ = auVar296._0_10_;
  auVar301._10_2_ = (short)((ulong)uVar182 >> 0x20);
  auVar300._10_6_ = auVar301._10_6_;
  auVar300._8_2_ = SUB42(fVar177,0);
  auVar300._0_8_ = auVar296._0_8_;
  auVar299._8_8_ = auVar300._8_8_;
  auVar299._6_2_ = (short)((ulong)uVar182 >> 0x10);
  auVar299._4_2_ = (short)((uint)auVar299._0_4_ >> 0x10);
  auVar194._12_2_ = (short)((uint)fVar294 >> 0x10);
  auVar194._0_12_ = auVar183;
  auVar194._14_2_ = uStack_582;
  auVar193._12_4_ = auVar194._12_4_;
  auVar193._0_10_ = auVar183._0_10_;
  auVar193._10_2_ = uStack_584;
  auVar192._10_6_ = auVar193._10_6_;
  auVar192._8_2_ = SUB42(fVar294,0);
  auVar192._0_8_ = auVar183._0_8_;
  auVar191._8_8_ = auVar192._8_8_;
  auVar191._6_2_ = uStack_586;
  auVar191._4_2_ = (short)((uint)auVar191._0_4_ >> 0x10);
  auVar195._0_4_ = (float)(int)local_588;
  fVar295 = (float)(auVar191._4_4_ >> 0x10);
  auVar184._0_8_ = CONCAT44(fVar295,auVar195._0_4_);
  auVar184._8_4_ = (float)(auVar192._8_4_ >> 0x10);
  uVar175 = (undefined2)(uVar12 >> 0x30);
  auVar279._8_4_ = 0;
  auVar279._0_8_ = uVar12;
  auVar279._12_2_ = uVar175;
  auVar279._14_2_ = uVar175;
  uVar175 = (undefined2)(uVar12 >> 0x20);
  auVar278._12_4_ = auVar279._12_4_;
  auVar278._8_2_ = 0;
  auVar278._0_8_ = uVar12;
  auVar278._10_2_ = uVar175;
  auVar277._10_6_ = auVar278._10_6_;
  auVar277._8_2_ = uVar175;
  auVar277._0_8_ = uVar12;
  uVar175 = (undefined2)(uVar12 >> 0x10);
  auVar100._4_8_ = auVar277._8_8_;
  auVar100._2_2_ = uVar175;
  auVar100._0_2_ = uVar175;
  auVar198._12_2_ = (short)((uint)fVar295 >> 0x10);
  auVar198._0_12_ = auVar184;
  auVar198._14_2_ = (short)((ulong)uVar11 >> 0x30);
  auVar197._12_4_ = auVar198._12_4_;
  auVar197._0_10_ = auVar184._0_10_;
  auVar197._10_2_ = (short)((ulong)uVar11 >> 0x20);
  auVar196._10_6_ = auVar197._10_6_;
  auVar196._8_2_ = SUB42(fVar295,0);
  auVar196._0_8_ = auVar184._0_8_;
  auVar195._8_8_ = auVar196._8_8_;
  auVar195._6_2_ = (short)((ulong)uVar11 >> 0x10);
  auVar195._4_2_ = (short)((uint)auVar195._0_4_ >> 0x10);
  fVar311 = (float)(auVar195._4_4_ >> 0x10);
  fVar313 = (float)(auVar196._8_4_ >> 0x10);
  uVar175 = (undefined2)(uVar13 >> 0x30);
  auVar149._8_4_ = 0;
  auVar149._0_8_ = uVar13;
  auVar149._12_2_ = uVar175;
  auVar149._14_2_ = uVar175;
  uVar175 = (undefined2)(uVar13 >> 0x20);
  auVar148._12_4_ = auVar149._12_4_;
  auVar148._8_2_ = 0;
  auVar148._0_8_ = uVar13;
  auVar148._10_2_ = uVar175;
  auVar147._10_6_ = auVar148._10_6_;
  auVar147._8_2_ = uVar175;
  auVar147._0_8_ = uVar13;
  uVar175 = (undefined2)(uVar13 >> 0x10);
  auVar101._4_8_ = auVar147._8_8_;
  auVar101._2_2_ = uVar175;
  auVar101._0_2_ = uVar175;
  uVar122 = *(ulong *)(prim + uVar119 * 0x14 + 6);
  uVar175 = (undefined2)(uVar122 >> 0x30);
  auVar152._8_4_ = 0;
  auVar152._0_8_ = uVar122;
  auVar152._12_2_ = uVar175;
  auVar152._14_2_ = uVar175;
  uVar175 = (undefined2)(uVar122 >> 0x20);
  auVar151._12_4_ = auVar152._12_4_;
  auVar151._8_2_ = 0;
  auVar151._0_8_ = uVar122;
  auVar151._10_2_ = uVar175;
  auVar150._10_6_ = auVar151._10_6_;
  auVar150._8_2_ = uVar175;
  auVar150._0_8_ = uVar122;
  uVar175 = (undefined2)(uVar122 >> 0x10);
  auVar102._4_8_ = auVar150._8_8_;
  auVar102._2_2_ = uVar175;
  auVar102._0_2_ = uVar175;
  fVar177 = (float)(auVar102._0_4_ >> 0x10);
  fVar229 = (float)(auVar150._8_4_ >> 0x10);
  uVar14 = *(ulong *)(prim + uVar119 * 0x18 + 6);
  uVar175 = (undefined2)(uVar14 >> 0x30);
  auVar201._8_4_ = 0;
  auVar201._0_8_ = uVar14;
  auVar201._12_2_ = uVar175;
  auVar201._14_2_ = uVar175;
  uVar175 = (undefined2)(uVar14 >> 0x20);
  auVar200._12_4_ = auVar201._12_4_;
  auVar200._8_2_ = 0;
  auVar200._0_8_ = uVar14;
  auVar200._10_2_ = uVar175;
  auVar199._10_6_ = auVar200._10_6_;
  auVar199._8_2_ = uVar175;
  auVar199._0_8_ = uVar14;
  uVar175 = (undefined2)(uVar14 >> 0x10);
  auVar103._4_8_ = auVar199._8_8_;
  auVar103._2_2_ = uVar175;
  auVar103._0_2_ = uVar175;
  uVar15 = *(ulong *)(prim + uVar119 * 0x1d + 6);
  uVar175 = (undefined2)(uVar15 >> 0x30);
  auVar155._8_4_ = 0;
  auVar155._0_8_ = uVar15;
  auVar155._12_2_ = uVar175;
  auVar155._14_2_ = uVar175;
  uVar175 = (undefined2)(uVar15 >> 0x20);
  auVar154._12_4_ = auVar155._12_4_;
  auVar154._8_2_ = 0;
  auVar154._0_8_ = uVar15;
  auVar154._10_2_ = uVar175;
  auVar153._10_6_ = auVar154._10_6_;
  auVar153._8_2_ = uVar175;
  auVar153._0_8_ = uVar15;
  uVar175 = (undefined2)(uVar15 >> 0x10);
  auVar104._4_8_ = auVar153._8_8_;
  auVar104._2_2_ = uVar175;
  auVar104._0_2_ = uVar175;
  fVar179 = (float)(auVar104._0_4_ >> 0x10);
  fVar230 = (float)(auVar153._8_4_ >> 0x10);
  uVar16 = *(ulong *)(prim + uVar119 * 0x21 + 6);
  uVar175 = (undefined2)(uVar16 >> 0x30);
  auVar204._8_4_ = 0;
  auVar204._0_8_ = uVar16;
  auVar204._12_2_ = uVar175;
  auVar204._14_2_ = uVar175;
  uVar175 = (undefined2)(uVar16 >> 0x20);
  auVar203._12_4_ = auVar204._12_4_;
  auVar203._8_2_ = 0;
  auVar203._0_8_ = uVar16;
  auVar203._10_2_ = uVar175;
  auVar202._10_6_ = auVar203._10_6_;
  auVar202._8_2_ = uVar175;
  auVar202._0_8_ = uVar16;
  uVar175 = (undefined2)(uVar16 >> 0x10);
  auVar105._4_8_ = auVar202._8_8_;
  auVar105._2_2_ = uVar175;
  auVar105._0_2_ = uVar175;
  uVar17 = *(ulong *)(prim + uVar119 * 0x1f + 6);
  uVar175 = (undefined2)(uVar17 >> 0x30);
  auVar158._8_4_ = 0;
  auVar158._0_8_ = uVar17;
  auVar158._12_2_ = uVar175;
  auVar158._14_2_ = uVar175;
  uVar175 = (undefined2)(uVar17 >> 0x20);
  auVar157._12_4_ = auVar158._12_4_;
  auVar157._8_2_ = 0;
  auVar157._0_8_ = uVar17;
  auVar157._10_2_ = uVar175;
  auVar156._10_6_ = auVar157._10_6_;
  auVar156._8_2_ = uVar175;
  auVar156._0_8_ = uVar17;
  uVar175 = (undefined2)(uVar17 >> 0x10);
  auVar106._4_8_ = auVar156._8_8_;
  auVar106._2_2_ = uVar175;
  auVar106._0_2_ = uVar175;
  fVar180 = (float)(auVar106._0_4_ >> 0x10);
  fVar258 = (float)(auVar156._8_4_ >> 0x10);
  uVar119 = *(ulong *)(prim + uVar119 * 0x23 + 6);
  uVar175 = (undefined2)(uVar119 >> 0x30);
  auVar207._8_4_ = 0;
  auVar207._0_8_ = uVar119;
  auVar207._12_2_ = uVar175;
  auVar207._14_2_ = uVar175;
  uVar175 = (undefined2)(uVar119 >> 0x20);
  auVar206._12_4_ = auVar207._12_4_;
  auVar206._8_2_ = 0;
  auVar206._0_8_ = uVar119;
  auVar206._10_2_ = uVar175;
  auVar205._10_6_ = auVar206._10_6_;
  auVar205._8_2_ = uVar175;
  auVar205._0_8_ = uVar119;
  uVar175 = (undefined2)(uVar119 >> 0x10);
  auVar107._4_8_ = auVar205._8_8_;
  auVar107._2_2_ = uVar175;
  auVar107._0_2_ = uVar175;
  auVar303._0_8_ =
       CONCAT44(((((float)(auVar299._4_4_ >> 0x10) - fVar294) * fVar233 + fVar294) - fVar404) *
                fVar371,((((float)(int)(short)uVar182 - auVar191._0_4_) * fVar233 + auVar191._0_4_)
                        - fVar403) * fVar368);
  auVar303._8_4_ =
       ((((float)(auVar300._8_4_ >> 0x10) - auVar183._8_4_) * fVar233 + auVar183._8_4_) - fVar407) *
       fVar376;
  auVar303._12_4_ =
       ((((float)(auVar301._12_4_ >> 0x10) - (float)(auVar189._12_4_ >> 0x10)) * fVar233 +
        (float)(auVar189._12_4_ >> 0x10)) - fVar409) * fVar378;
  auVar318._0_4_ =
       ((((float)(int)(short)uVar12 - auVar195._0_4_) * fVar233 + auVar195._0_4_) - fVar403) *
       fVar368;
  auVar318._4_4_ =
       ((((float)(auVar100._0_4_ >> 0x10) - fVar295) * fVar233 + fVar295) - fVar404) * fVar371;
  auVar318._8_4_ =
       ((((float)(auVar277._8_4_ >> 0x10) - auVar184._8_4_) * fVar233 + auVar184._8_4_) - fVar407) *
       fVar376;
  auVar318._12_4_ =
       ((((float)(auVar278._12_4_ >> 0x10) - (float)(auVar193._12_4_ >> 0x10)) * fVar233 +
        (float)(auVar193._12_4_ >> 0x10)) - fVar409) * fVar378;
  auVar334._0_8_ =
       CONCAT44(((((float)(auVar101._0_4_ >> 0x10) - fVar311) * fVar233 + fVar311) - fVar340) *
                fVar362,((((float)(int)(short)uVar13 - (float)(int)(short)uVar11) * fVar233 +
                         (float)(int)(short)uVar11) - fVar328) * fVar351);
  auVar334._8_4_ =
       ((((float)(auVar147._8_4_ >> 0x10) - fVar313) * fVar233 + fVar313) - fVar344) * fVar363;
  auVar334._12_4_ =
       ((((float)(auVar148._12_4_ >> 0x10) - (float)(auVar197._12_4_ >> 0x10)) * fVar233 +
        (float)(auVar197._12_4_ >> 0x10)) - fVar349) * fVar366;
  auVar373._0_4_ =
       ((((float)(int)(short)uVar14 - (float)(int)(short)uVar122) * fVar233 +
        (float)(int)(short)uVar122) - fVar328) * fVar351;
  auVar373._4_4_ =
       ((((float)(auVar103._0_4_ >> 0x10) - fVar177) * fVar233 + fVar177) - fVar340) * fVar362;
  auVar373._8_4_ =
       ((((float)(auVar199._8_4_ >> 0x10) - fVar229) * fVar233 + fVar229) - fVar344) * fVar363;
  auVar373._12_4_ =
       ((((float)(auVar200._12_4_ >> 0x10) - (float)(auVar151._12_4_ >> 0x10)) * fVar233 +
        (float)(auVar151._12_4_ >> 0x10)) - fVar349) * fVar366;
  auVar385._0_8_ =
       CONCAT44(((((float)(auVar105._0_4_ >> 0x10) - fVar179) * fVar233 + fVar179) - fVar439) *
                fVar140,((((float)(int)(short)uVar16 - (float)(int)(short)uVar15) * fVar233 +
                         (float)(int)(short)uVar15) - fVar434) * fVar406);
  auVar385._8_4_ =
       ((((float)(auVar202._8_4_ >> 0x10) - fVar230) * fVar233 + fVar230) - fVar441) * fVar181;
  auVar385._12_4_ =
       ((((float)(auVar203._12_4_ >> 0x10) - (float)(auVar154._12_4_ >> 0x10)) * fVar233 +
        (float)(auVar154._12_4_ >> 0x10)) - fVar418) * fVar259;
  auVar401._0_4_ =
       ((((float)(int)(short)uVar119 - (float)(int)(short)uVar17) * fVar233 +
        (float)(int)(short)uVar17) - fVar434) * fVar406;
  auVar401._4_4_ =
       ((((float)(auVar107._0_4_ >> 0x10) - fVar180) * fVar233 + fVar180) - fVar439) * fVar140;
  auVar401._8_4_ =
       ((((float)(auVar205._8_4_ >> 0x10) - fVar258) * fVar233 + fVar258) - fVar441) * fVar181;
  auVar401._12_4_ =
       ((((float)(auVar206._12_4_ >> 0x10) - (float)(auVar157._12_4_ >> 0x10)) * fVar233 +
        (float)(auVar157._12_4_ >> 0x10)) - fVar418) * fVar259;
  auVar247._8_4_ = auVar303._8_4_;
  auVar247._0_8_ = auVar303._0_8_;
  auVar247._12_4_ = auVar303._12_4_;
  auVar248 = minps(auVar247,auVar318);
  auVar159._8_4_ = auVar334._8_4_;
  auVar159._0_8_ = auVar334._0_8_;
  auVar159._12_4_ = auVar334._12_4_;
  auVar333 = minps(auVar159,auVar373);
  auVar248 = maxps(auVar248,auVar333);
  auVar160._8_4_ = auVar385._8_4_;
  auVar160._0_8_ = auVar385._0_8_;
  auVar160._12_4_ = auVar385._12_4_;
  auVar333 = minps(auVar160,auVar401);
  uVar123 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar208._4_4_ = uVar123;
  auVar208._0_4_ = uVar123;
  auVar208._8_4_ = uVar123;
  auVar208._12_4_ = uVar123;
  auVar333 = maxps(auVar333,auVar208);
  auVar333 = maxps(auVar248,auVar333);
  fVar140 = auVar333._0_4_ * 0.99999964;
  fVar177 = auVar333._4_4_ * 0.99999964;
  fVar179 = auVar333._8_4_ * 0.99999964;
  fVar180 = auVar333._12_4_ * 0.99999964;
  auVar333 = maxps(auVar303,auVar318);
  auVar248 = maxps(auVar334,auVar373);
  auVar333 = minps(auVar333,auVar248);
  auVar248 = maxps(auVar385,auVar401);
  fVar406 = (ray->super_RayK<1>).tfar;
  auVar209._4_4_ = fVar406;
  auVar209._0_4_ = fVar406;
  auVar209._8_4_ = fVar406;
  auVar209._12_4_ = fVar406;
  auVar248 = minps(auVar248,auVar209);
  auVar333 = minps(auVar333,auVar248);
  auVar210._0_4_ = -(uint)(PVar19 != (Primitive)0x0 && fVar140 <= auVar333._0_4_ * 1.0000004);
  auVar210._4_4_ = -(uint)(1 < (byte)PVar19 && fVar177 <= auVar333._4_4_ * 1.0000004);
  auVar210._8_4_ = -(uint)(2 < (byte)PVar19 && fVar179 <= auVar333._8_4_ * 1.0000004);
  auVar210._12_4_ = -(uint)(3 < (byte)PVar19 && fVar180 <= auVar333._12_4_ * 1.0000004);
  uVar123 = movmskps((int)prim,auVar210);
  local_310 = CONCAT44((int)((ulong)prim >> 0x20),uVar123);
  auVar211._0_12_ = mm_lookupmask_ps._240_12_;
  auVar211._12_4_ = 0;
  local_318 = prim;
LAB_003553c5:
  if (local_310 == 0) {
    return;
  }
  lVar129 = 0;
  if (local_310 != 0) {
    for (; (local_310 >> lVar129 & 1) == 0; lVar129 = lVar129 + 1) {
    }
  }
  uVar132 = *(uint *)(local_318 + 2);
  uVar133 = *(uint *)(local_318 + lVar129 * 4 + 6);
  pGVar26 = (context->scene->geometries).items[uVar132].ptr;
  uVar122 = (ulong)*(uint *)(*(long *)&pGVar26->field_0x58 +
                            (ulong)uVar133 *
                            pGVar26[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                            _M_i);
  fVar406 = pGVar26->fnumTimeSegments;
  fVar181 = (pGVar26->time_range).lower;
  fVar229 = (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar181) /
            ((pGVar26->time_range).upper - fVar181)) * fVar406;
  fVar181 = floorf(fVar229);
  fVar406 = fVar406 + -1.0;
  if (fVar406 <= fVar181) {
    fVar181 = fVar406;
  }
  fVar406 = 0.0;
  if (0.0 <= fVar181) {
    fVar406 = fVar181;
  }
  fVar229 = fVar229 - fVar406;
  fVar311 = 1.0 - fVar229;
  _Var27 = pGVar26[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar130 = (long)(int)fVar406 * 0x38;
  lVar129 = *(long *)(_Var27 + lVar130);
  lVar28 = *(long *)(_Var27 + 0x10 + lVar130);
  pRVar124 = (RTCIntersectArguments *)(lVar28 * (uVar122 + 3));
  pRVar126 = *(RTCIntersectArguments **)(_Var27 + 0x38 + lVar130);
  lVar130 = *(long *)(_Var27 + 0x48 + lVar130);
  pRVar1 = (RTCRayQueryFlags *)((long)&pRVar126->flags + uVar122 * lVar130);
  pfVar2 = (float *)(lVar129 + lVar28 * uVar122);
  fVar313 = *pfVar2 * fVar311 + (float)*pRVar1 * fVar229;
  fVar233 = pfVar2[1] * fVar311 + (float)pRVar1[1] * fVar229;
  fVar328 = pfVar2[2] * fVar311 + (float)pRVar1[2] * fVar229;
  pRVar3 = (RTCRayQueryFlags *)((long)&pRVar126->flags + (uVar122 + 1) * lVar130);
  pfVar4 = (float *)(lVar129 + lVar28 * (uVar122 + 1));
  fVar366 = *pfVar4 * fVar311 + (float)*pRVar3 * fVar229;
  fVar368 = pfVar4[1] * fVar311 + (float)pRVar3[1] * fVar229;
  fVar371 = pfVar4[2] * fVar311 + (float)pRVar3[2] * fVar229;
  pRVar5 = (RTCRayQueryFlags *)((long)&pRVar126->flags + (uVar122 + 2) * lVar130);
  pfVar6 = (float *)(lVar129 + lVar28 * (uVar122 + 2));
  fVar340 = *pfVar6 * fVar311 + (float)*pRVar5 * fVar229;
  fVar344 = pfVar6[1] * fVar311 + (float)pRVar5[1] * fVar229;
  fVar349 = pfVar6[2] * fVar311 + (float)pRVar5[2] * fVar229;
  pRVar7 = (RTCRayQueryFlags *)((long)&pRVar126->flags + lVar130 * (uVar122 + 3));
  pfVar8 = (float *)((long)&pRVar124->flags + lVar129);
  local_5f8._0_4_ = fVar311 * *pfVar8 + fVar229 * (float)*pRVar7;
  local_5f8._4_4_ = fVar311 * pfVar8[1] + fVar229 * (float)pRVar7[1];
  fStack_5f0 = fVar311 * pfVar8[2] + fVar229 * (float)pRVar7[2];
  fVar406 = (ray->super_RayK<1>).org.field_0.m128[0];
  fVar181 = (ray->super_RayK<1>).org.field_0.m128[1];
  fVar230 = (ray->super_RayK<1>).org.field_0.m128[2];
  local_338 = (ray->super_RayK<1>).dir.field_0.m128[0];
  fVar258 = (ray->super_RayK<1>).dir.field_0.m128[1];
  fVar259 = (ray->super_RayK<1>).dir.field_0.m128[2];
  fVar294 = (ray->super_RayK<1>).dir.field_0.m128[3];
  fVar351 = local_338 * local_338;
  fVar362 = fVar258 * fVar258;
  fVar363 = fVar259 * fVar259;
  fVar294 = fVar294 * fVar294;
  fVar295 = fVar351 + fVar362 + fVar363;
  auVar304._0_8_ = CONCAT44(fVar362 + fVar362 + fVar294,fVar295);
  auVar304._8_4_ = fVar363 + fVar362 + fVar363;
  auVar304._12_4_ = fVar294 + fVar362 + fVar294;
  auVar280._8_4_ = auVar304._8_4_;
  auVar280._0_8_ = auVar304._0_8_;
  auVar280._12_4_ = auVar304._12_4_;
  auVar333 = rcpss(auVar280,auVar304);
  local_4e8 = (2.0 - fVar295 * auVar333._0_4_) * auVar333._0_4_ *
              (((fVar328 + fVar371 + fVar349 + fStack_5f0) * 0.25 - fVar230) * fVar259 +
              ((fVar233 + fVar368 + fVar344 + (float)local_5f8._4_4_) * 0.25 - fVar181) * fVar258 +
              ((fVar313 + fVar366 + fVar340 + (float)local_5f8._0_4_) * 0.25 - fVar406) * local_338)
  ;
  local_328 = ZEXT416((uint)local_4e8);
  fVar406 = local_338 * local_4e8 + fVar406;
  fVar181 = fVar258 * local_4e8 + fVar181;
  fVar230 = fVar259 * local_4e8 + fVar230;
  fVar313 = fVar313 - fVar406;
  fVar233 = fVar233 - fVar181;
  fVar328 = fVar328 - fVar230;
  fVar294 = (pfVar2[3] * fVar311 + (float)pRVar1[3] * fVar229) - 0.0;
  fVar340 = fVar340 - fVar406;
  fVar344 = fVar344 - fVar181;
  fVar349 = fVar349 - fVar230;
  fVar295 = (pfVar6[3] * fVar311 + (float)pRVar5[3] * fVar229) - 0.0;
  fVar366 = fVar366 - fVar406;
  fVar368 = fVar368 - fVar181;
  fVar371 = fVar371 - fVar230;
  fVar376 = (pfVar4[3] * fVar311 + (float)pRVar3[3] * fVar229) - 0.0;
  local_5f8._0_4_ = (float)local_5f8._0_4_ - fVar406;
  local_5f8._4_4_ = (float)local_5f8._4_4_ - fVar181;
  fStack_5f0 = fStack_5f0 - fVar230;
  fStack_5ec = (fVar311 * pfVar8[3] + fVar229 * (float)pRVar7[3]) - 0.0;
  fVar229 = fVar351 + fVar363 + fVar362;
  fVar230 = fVar351 + fVar363 + fVar362;
  fVar311 = fVar351 + fVar363 + fVar362;
  fVar351 = fVar351 + fVar363 + fVar362;
  local_4c8._4_4_ = fVar368;
  local_4c8._0_4_ = fVar366;
  fStack_4c0 = fVar371;
  fStack_4bc = fVar376;
  local_2f8 = fVar295;
  fStack_2f4 = fVar295;
  fStack_2f0 = fVar295;
  fStack_2ec = fVar295;
  fStack_334 = local_338;
  fStack_330 = local_338;
  fStack_32c = local_338;
  local_308 = ABS(fVar229);
  fStack_304 = ABS(fVar230);
  fStack_300 = ABS(fVar311);
  fStack_2fc = ABS(fVar351);
  pSVar120 = (StackEntry *)0x1;
  local_61c = 1.4013e-45;
  fVar406 = 0.0;
  fVar181 = 1.0;
  pRVar127 = (RTCIntersectArguments *)0x0;
  fStack_4e4 = local_4e8;
  fStack_4e0 = local_4e8;
  fStack_4dc = local_4e8;
  do {
    fVar404 = fVar181 - fVar406;
    fVar363 = fVar404 * 0.0 + fVar406;
    fVar378 = fVar404 * 0.33333334 + fVar406;
    fVar381 = fVar404 * 0.6666667 + fVar406;
    fVar391 = fVar404 * 1.0 + fVar406;
    fVar382 = 1.0 - fVar363;
    fVar392 = 1.0 - fVar378;
    fVar395 = 1.0 - fVar381;
    fVar397 = 1.0 - fVar391;
    fVar394 = fVar366 * fVar382 + fVar340 * fVar363;
    fVar409 = fVar366 * fVar392 + fVar340 * fVar378;
    fVar379 = fVar366 * fVar395 + fVar340 * fVar381;
    fVar380 = fVar366 * fVar397 + fVar340 * fVar391;
    fVar362 = fVar368 * fVar382 + fVar344 * fVar363;
    fVar399 = fVar368 * fVar392 + fVar344 * fVar378;
    fVar403 = fVar368 * fVar395 + fVar344 * fVar381;
    fVar407 = fVar368 * fVar397 + fVar344 * fVar391;
    fVar364 = fVar371 * fVar382 + fVar349 * fVar363;
    fVar367 = fVar371 * fVar392 + fVar349 * fVar378;
    fVar369 = fVar371 * fVar395 + fVar349 * fVar381;
    fVar370 = fVar371 * fVar397 + fVar349 * fVar391;
    fVar345 = fVar376 * fVar382 + local_2f8 * fVar363;
    fVar350 = fVar376 * fVar392 + fStack_2f4 * fVar378;
    fVar352 = fVar376 * fVar395 + fStack_2f0 * fVar381;
    fVar353 = fVar376 * fVar397 + fStack_2ec * fVar391;
    fVar418 = (fVar313 * fVar382 + fVar366 * fVar363) * fVar382 + fVar363 * fVar394;
    fVar426 = (fVar313 * fVar392 + fVar366 * fVar378) * fVar392 + fVar378 * fVar409;
    fVar429 = (fVar313 * fVar395 + fVar366 * fVar381) * fVar395 + fVar381 * fVar379;
    fVar434 = (fVar313 * fVar397 + fVar366 * fVar391) * fVar397 + fVar391 * fVar380;
    fVar439 = (fVar233 * fVar382 + fVar368 * fVar363) * fVar382 + fVar363 * fVar362;
    fVar441 = (fVar233 * fVar392 + fVar368 * fVar378) * fVar392 + fVar378 * fVar399;
    fVar312 = (fVar233 * fVar395 + fVar368 * fVar381) * fVar395 + fVar381 * fVar403;
    fVar314 = (fVar233 * fVar397 + fVar368 * fVar391) * fVar397 + fVar391 * fVar407;
    fVar315 = (fVar328 * fVar382 + fVar371 * fVar363) * fVar382 + fVar363 * fVar364;
    fVar329 = (fVar328 * fVar392 + fVar371 * fVar378) * fVar392 + fVar378 * fVar367;
    fVar330 = (fVar328 * fVar395 + fVar371 * fVar381) * fVar395 + fVar381 * fVar369;
    fVar331 = (fVar328 * fVar397 + fVar371 * fVar391) * fVar397 + fVar391 * fVar370;
    fVar332 = (fVar294 * fVar382 + fVar376 * fVar363) * fVar382 + fVar363 * fVar345;
    fVar341 = (fVar294 * fVar392 + fVar376 * fVar378) * fVar392 + fVar378 * fVar350;
    fVar342 = (fVar294 * fVar395 + fVar376 * fVar381) * fVar395 + fVar381 * fVar352;
    fVar343 = (fVar294 * fVar397 + fVar376 * fVar391) * fVar397 + fVar391 * fVar353;
    fVar372 = fVar394 * fVar382 + (fVar340 * fVar382 + (float)local_5f8._0_4_ * fVar363) * fVar363;
    fVar377 = fVar409 * fVar392 + (fVar340 * fVar392 + (float)local_5f8._0_4_ * fVar378) * fVar378;
    fVar379 = fVar379 * fVar395 + (fVar340 * fVar395 + (float)local_5f8._0_4_ * fVar381) * fVar381;
    fVar380 = fVar380 * fVar397 + (fVar340 * fVar397 + (float)local_5f8._0_4_ * fVar391) * fVar391;
    fVar394 = fVar362 * fVar382 + (fVar344 * fVar382 + (float)local_5f8._4_4_ * fVar363) * fVar363;
    fVar399 = fVar399 * fVar392 + (fVar344 * fVar392 + (float)local_5f8._4_4_ * fVar378) * fVar378;
    fVar403 = fVar403 * fVar395 + (fVar344 * fVar395 + (float)local_5f8._4_4_ * fVar381) * fVar381;
    fVar409 = fVar407 * fVar397 + (fVar344 * fVar397 + (float)local_5f8._4_4_ * fVar391) * fVar391;
    fVar364 = fVar364 * fVar382 + (fVar349 * fVar382 + fStack_5f0 * fVar363) * fVar363;
    fVar367 = fVar367 * fVar392 + (fVar349 * fVar392 + fStack_5f0 * fVar378) * fVar378;
    fVar369 = fVar369 * fVar395 + (fVar349 * fVar395 + fStack_5f0 * fVar381) * fVar381;
    fVar370 = fVar370 * fVar397 + (fVar349 * fVar397 + fStack_5f0 * fVar391) * fVar391;
    fVar345 = fVar345 * fVar382 + (local_2f8 * fVar382 + fStack_5ec * fVar363) * fVar363;
    fVar350 = fVar350 * fVar392 + (fStack_2f4 * fVar392 + fStack_5ec * fVar378) * fVar378;
    fVar352 = fVar352 * fVar395 + (fStack_2f0 * fVar395 + fStack_5ec * fVar381) * fVar381;
    fVar353 = fVar353 * fVar397 + (fStack_2ec * fVar397 + fStack_5ec * fVar391) * fVar391;
    local_4d8 = fVar382 * fVar418 + fVar363 * fVar372;
    fStack_4d4 = fVar392 * fVar426 + fVar378 * fVar377;
    fStack_4d0 = fVar395 * fVar429 + fVar381 * fVar379;
    fStack_4cc = fVar397 * fVar434 + fVar391 * fVar380;
    fVar419 = fVar382 * fVar439 + fVar363 * fVar394;
    fVar427 = fVar392 * fVar441 + fVar378 * fVar399;
    fVar430 = fVar395 * fVar312 + fVar381 * fVar403;
    fVar432 = fVar397 * fVar314 + fVar391 * fVar409;
    fVar400 = fVar382 * fVar315 + fVar363 * fVar364;
    fVar405 = fVar392 * fVar329 + fVar378 * fVar367;
    fVar408 = fVar395 * fVar330 + fVar381 * fVar369;
    fVar410 = fVar397 * fVar331 + fVar391 * fVar370;
    fVar362 = fVar404 * 0.11111111;
    fVar382 = fVar382 * fVar332 + fVar363 * fVar345;
    fVar392 = fVar392 * fVar341 + fVar378 * fVar350;
    auVar386._0_8_ = CONCAT44(fVar392,fVar382);
    auVar386._8_4_ = fVar395 * fVar342 + fVar381 * fVar352;
    auVar386._12_4_ = fVar397 * fVar343 + fVar391 * fVar353;
    fVar395 = (fVar372 - fVar418) * 3.0 * fVar362;
    fVar397 = (fVar377 - fVar426) * 3.0 * fVar362;
    fVar416 = (fVar379 - fVar429) * 3.0 * fVar362;
    fVar417 = (fVar380 - fVar434) * 3.0 * fVar362;
    fVar407 = (fVar394 - fVar439) * 3.0 * fVar362;
    fVar426 = (fVar399 - fVar441) * 3.0 * fVar362;
    fVar439 = (fVar403 - fVar312) * 3.0 * fVar362;
    fVar314 = (fVar409 - fVar314) * 3.0 * fVar362;
    fVar364 = (fVar364 - fVar315) * 3.0 * fVar362;
    fVar367 = (fVar367 - fVar329) * 3.0 * fVar362;
    fVar369 = (fVar369 - fVar330) * 3.0 * fVar362;
    fVar372 = (fVar370 - fVar331) * 3.0 * fVar362;
    fVar363 = fVar362 * (fVar350 - fVar341) * 3.0;
    fVar378 = fVar362 * (fVar352 - fVar342) * 3.0;
    fVar381 = fVar362 * (fVar353 - fVar343) * 3.0;
    auVar212._4_4_ = auVar386._8_4_;
    auVar212._0_4_ = fVar392;
    auVar212._8_4_ = auVar386._12_4_;
    auVar212._12_4_ = 0;
    local_608._4_4_ = fVar392 + fVar363;
    local_608._0_4_ = fVar382 + fVar362 * (fVar345 - fVar332) * 3.0;
    fStack_600 = auVar386._8_4_ + fVar378;
    fStack_5fc = auVar386._12_4_ + fVar381;
    auVar305._0_8_ = CONCAT44(auVar386._8_4_ - fVar378,fVar392 - fVar363);
    auVar305._8_4_ = auVar386._12_4_ - fVar381;
    auVar305._12_4_ = 0;
    local_348._0_4_ = fVar427 - fVar419;
    local_348._4_4_ = fVar430 - fVar427;
    fStack_340 = fVar432 - fVar430;
    fStack_33c = 0.0 - fVar432;
    local_358._0_4_ = fVar405 - fVar400;
    local_358._4_4_ = fVar408 - fVar405;
    fStack_350 = fVar410 - fVar408;
    fStack_34c = 0.0 - fVar410;
    fVar391 = fVar407 * (float)local_358._0_4_ - fVar364 * (float)local_348._0_4_;
    fVar394 = fVar426 * (float)local_358._4_4_ - fVar367 * (float)local_348._4_4_;
    fVar399 = fVar439 * fStack_350 - fVar369 * fStack_340;
    fVar403 = fVar314 * fStack_34c - fVar372 * fStack_33c;
    local_368 = fStack_4d4 - local_4d8;
    fStack_364 = fStack_4d0 - fStack_4d4;
    fStack_360 = fStack_4cc - fStack_4d0;
    fStack_35c = 0.0 - fStack_4cc;
    fVar409 = fVar364 * local_368 - fVar395 * (float)local_358._0_4_;
    fVar418 = fVar367 * fStack_364 - fVar397 * (float)local_358._4_4_;
    fVar429 = fVar369 * fStack_360 - fVar416 * fStack_350;
    fVar434 = fVar372 * fStack_35c - fVar417 * fStack_34c;
    fVar441 = fVar395 * (float)local_348._0_4_ - fVar407 * local_368;
    fVar312 = fVar397 * (float)local_348._4_4_ - fVar426 * fStack_364;
    fVar315 = fVar416 * fStack_340 - fVar439 * fStack_360;
    fVar329 = fVar417 * fStack_33c - fVar314 * fStack_35c;
    auVar161._0_4_ = (float)local_358._0_4_ * (float)local_358._0_4_;
    auVar161._4_4_ = (float)local_358._4_4_ * (float)local_358._4_4_;
    auVar161._8_4_ = fStack_350 * fStack_350;
    auVar161._12_4_ = fStack_34c * fStack_34c;
    auVar346._0_4_ =
         local_368 * local_368 + (float)local_348._0_4_ * (float)local_348._0_4_ + auVar161._0_4_;
    auVar346._4_4_ =
         fStack_364 * fStack_364 + (float)local_348._4_4_ * (float)local_348._4_4_ + auVar161._4_4_;
    auVar346._8_4_ = fStack_360 * fStack_360 + fStack_340 * fStack_340 + auVar161._8_4_;
    auVar346._12_4_ = fStack_35c * fStack_35c + fStack_33c * fStack_33c + auVar161._12_4_;
    auVar333 = rcpps(auVar161,auVar346);
    fVar362 = auVar333._0_4_;
    fVar363 = auVar333._4_4_;
    fVar378 = auVar333._8_4_;
    fVar381 = auVar333._12_4_;
    fVar362 = (1.0 - fVar362 * auVar346._0_4_) * fVar362 + fVar362;
    fVar363 = (1.0 - fVar363 * auVar346._4_4_) * fVar363 + fVar363;
    fVar378 = (1.0 - fVar378 * auVar346._8_4_) * fVar378 + fVar378;
    fVar381 = (1.0 - fVar381 * auVar346._12_4_) * fVar381 + fVar381;
    fVar330 = (float)local_358._0_4_ * fVar426 - (float)local_348._0_4_ * fVar367;
    fVar331 = (float)local_358._4_4_ * fVar439 - (float)local_348._4_4_ * fVar369;
    fVar332 = fStack_350 * fVar314 - fStack_340 * fVar372;
    fVar341 = fStack_34c * 0.0 - fStack_33c * 0.0;
    fVar342 = local_368 * fVar367 - (float)local_358._0_4_ * fVar397;
    fVar343 = fStack_364 * fVar369 - (float)local_358._4_4_ * fVar416;
    fVar345 = fStack_360 * fVar372 - fStack_350 * fVar417;
    fVar350 = fStack_35c * 0.0 - fStack_34c * 0.0;
    fVar352 = (float)local_348._0_4_ * fVar397 - local_368 * fVar426;
    fVar353 = (float)local_348._4_4_ * fVar416 - fStack_364 * fVar439;
    fVar370 = fStack_340 * fVar417 - fStack_360 * fVar314;
    fVar377 = fStack_33c * 0.0 - fStack_35c * 0.0;
    auVar411._0_4_ = fVar342 * fVar342 + fVar352 * fVar352;
    auVar411._4_4_ = fVar343 * fVar343 + fVar353 * fVar353;
    auVar411._8_4_ = fVar345 * fVar345 + fVar370 * fVar370;
    auVar411._12_4_ = fVar350 * fVar350 + fVar377 * fVar377;
    auVar319._0_4_ = (fVar391 * fVar391 + fVar409 * fVar409 + fVar441 * fVar441) * fVar362;
    auVar319._4_4_ = (fVar394 * fVar394 + fVar418 * fVar418 + fVar312 * fVar312) * fVar363;
    auVar319._8_4_ = (fVar399 * fVar399 + fVar429 * fVar429 + fVar315 * fVar315) * fVar378;
    auVar319._12_4_ = (fVar403 * fVar403 + fVar434 * fVar434 + fVar329 * fVar329) * fVar381;
    auVar354._0_4_ = (fVar330 * fVar330 + auVar411._0_4_) * fVar362;
    auVar354._4_4_ = (fVar331 * fVar331 + auVar411._4_4_) * fVar363;
    auVar354._8_4_ = (fVar332 * fVar332 + auVar411._8_4_) * fVar378;
    auVar354._12_4_ = (fVar341 * fVar341 + auVar411._12_4_) * fVar381;
    auVar248 = maxps(auVar319,auVar354);
    auVar335._8_4_ = auVar386._8_4_;
    auVar335._0_8_ = auVar386._0_8_;
    auVar335._12_4_ = auVar386._12_4_;
    auVar333 = maxps(auVar335,_local_608);
    auVar355._8_4_ = auVar305._8_4_;
    auVar355._0_8_ = auVar305._0_8_;
    auVar355._12_4_ = 0;
    auVar356 = maxps(auVar355,auVar212);
    auVar356 = maxps(auVar333,auVar356);
    auVar387 = minps(auVar386,_local_608);
    auVar333 = minps(auVar305,auVar212);
    auVar387 = minps(auVar387,auVar333);
    auVar333 = sqrtps(auVar212,auVar248);
    auVar248 = rsqrtps(auVar411,auVar346);
    fVar362 = auVar248._0_4_;
    fVar378 = auVar248._4_4_;
    fVar391 = auVar248._8_4_;
    fVar399 = auVar248._12_4_;
    fVar363 = fVar362 * fVar362 * auVar346._0_4_ * -0.5 * fVar362 + fVar362 * 1.5;
    fVar381 = fVar378 * fVar378 * auVar346._4_4_ * -0.5 * fVar378 + fVar378 * 1.5;
    fVar394 = fVar391 * fVar391 * auVar346._8_4_ * -0.5 * fVar391 + fVar391 * 1.5;
    fVar403 = fVar399 * fVar399 * auVar346._12_4_ * -0.5 * fVar399 + fVar399 * 1.5;
    fVar409 = 0.0 - fVar419;
    fVar429 = 0.0 - fVar427;
    fVar441 = 0.0 - fVar430;
    fVar315 = 0.0 - fVar432;
    fVar342 = 0.0 - fVar400;
    fVar343 = 0.0 - fVar405;
    fVar345 = 0.0 - fVar408;
    fVar350 = 0.0 - fVar410;
    fVar352 = 0.0 - local_4d8;
    fVar353 = 0.0 - fStack_4d4;
    fVar370 = 0.0 - fStack_4d0;
    fVar377 = 0.0 - fStack_4cc;
    fVar330 = local_338 * local_368 * fVar363 +
              fVar258 * (float)local_348._0_4_ * fVar363 +
              fVar259 * (float)local_358._0_4_ * fVar363;
    fVar331 = fStack_334 * fStack_364 * fVar381 +
              fVar258 * (float)local_348._4_4_ * fVar381 +
              fVar259 * (float)local_358._4_4_ * fVar381;
    fVar332 = fStack_330 * fStack_360 * fVar394 +
              fVar258 * fStack_340 * fVar394 + fVar259 * fStack_350 * fVar394;
    fVar341 = fStack_32c * fStack_35c * fVar403 +
              fVar258 * fStack_33c * fVar403 + fVar259 * fStack_34c * fVar403;
    fVar435 = local_368 * fVar363 * fVar352 +
              (float)local_348._0_4_ * fVar363 * fVar409 +
              (float)local_358._0_4_ * fVar363 * fVar342;
    fVar440 = fStack_364 * fVar381 * fVar353 +
              (float)local_348._4_4_ * fVar381 * fVar429 +
              (float)local_358._4_4_ * fVar381 * fVar343;
    fVar442 = fStack_360 * fVar394 * fVar370 +
              fStack_340 * fVar394 * fVar441 + fStack_350 * fVar394 * fVar345;
    fVar443 = fStack_35c * fVar403 * fVar377 +
              fStack_33c * fVar403 * fVar315 + fStack_34c * fVar403 * fVar350;
    fVar420 = (local_338 * fVar352 + fVar258 * fVar409 + fVar259 * fVar342) - fVar330 * fVar435;
    fVar428 = (fStack_334 * fVar353 + fVar258 * fVar429 + fVar259 * fVar343) - fVar331 * fVar440;
    fVar431 = (fStack_330 * fVar370 + fVar258 * fVar441 + fVar259 * fVar345) - fVar332 * fVar442;
    fVar433 = (fStack_32c * fVar377 + fVar258 * fVar315 + fVar259 * fVar350) - fVar341 * fVar443;
    fVar362 = (fVar352 * fVar352 + fVar409 * fVar409 + fVar342 * fVar342) - fVar435 * fVar435;
    fVar378 = (fVar353 * fVar353 + fVar429 * fVar429 + fVar343 * fVar343) - fVar440 * fVar440;
    fVar391 = (fVar370 * fVar370 + fVar441 * fVar441 + fVar345 * fVar345) - fVar442 * fVar442;
    fVar399 = (fVar377 * fVar377 + fVar315 * fVar315 + fVar350 * fVar350) - fVar443 * fVar443;
    fVar418 = (auVar356._0_4_ + auVar333._0_4_) * 1.0000002;
    fVar434 = (auVar356._4_4_ + auVar333._4_4_) * 1.0000002;
    fVar312 = (auVar356._8_4_ + auVar333._8_4_) * 1.0000002;
    fVar329 = (auVar356._12_4_ + auVar333._12_4_) * 1.0000002;
    fVar379 = fVar362 - fVar418 * fVar418;
    fVar380 = fVar378 - fVar434 * fVar434;
    fVar382 = fVar391 - fVar312 * fVar312;
    fVar392 = fVar399 - fVar329 * fVar329;
    auVar357._0_4_ = fVar229 - fVar330 * fVar330;
    auVar357._4_4_ = fVar230 - fVar331 * fVar331;
    auVar357._8_4_ = fVar311 - fVar332 * fVar332;
    auVar357._12_4_ = fVar351 - fVar341 * fVar341;
    auVar421._0_4_ = fVar420 + fVar420;
    auVar421._4_4_ = fVar428 + fVar428;
    auVar421._8_4_ = fVar431 + fVar431;
    auVar421._12_4_ = fVar433 + fVar433;
    auVar213._0_4_ = auVar421._0_4_ * auVar421._0_4_ - auVar357._0_4_ * 4.0 * fVar379;
    auVar213._4_4_ = auVar421._4_4_ * auVar421._4_4_ - auVar357._4_4_ * 4.0 * fVar380;
    auVar213._8_4_ = auVar421._8_4_ * auVar421._8_4_ - auVar357._8_4_ * 4.0 * fVar382;
    auVar213._12_4_ = auVar421._12_4_ * auVar421._12_4_ - auVar357._12_4_ * 4.0 * fVar392;
    auVar320._4_4_ = -(uint)(0.0 <= auVar213._4_4_);
    auVar320._0_4_ = -(uint)(0.0 <= auVar213._0_4_);
    auVar320._8_4_ = -(uint)(0.0 <= auVar213._8_4_);
    auVar320._12_4_ = -(uint)(0.0 <= auVar213._12_4_);
    iVar257 = movmskps((int)pSVar120,auVar320);
    fStack_4f0 = -auVar421._8_4_;
    fStack_4ec = -auVar421._12_4_;
    auVar374._0_8_ = CONCAT44(fVar331 * fVar331,fVar330 * fVar330) & 0x7fffffff7fffffff;
    auVar374._8_4_ = ABS(fVar332 * fVar332);
    auVar374._12_4_ = ABS(fVar341 * fVar341);
    fVar418 = ABS(auVar357._0_4_);
    fVar434 = ABS(auVar357._4_4_);
    fVar312 = ABS(auVar357._8_4_);
    fVar329 = ABS(auVar357._12_4_);
    uVar122 = CONCAT44(auVar421._4_4_,auVar421._0_4_);
    local_4f8 = (undefined1  [8])(uVar122 ^ 0x8000000080000000);
    if (iVar257 == 0) {
      iVar257 = 0;
      auVar358 = _DAT_01f45a40;
      auVar412 = _DAT_01f45a30;
    }
    else {
      auVar356 = sqrtps(auVar421,auVar213);
      bVar131 = 0.0 <= auVar213._0_4_;
      uVar134 = -(uint)bVar131;
      bVar29 = 0.0 <= auVar213._4_4_;
      uVar136 = -(uint)bVar29;
      bVar30 = 0.0 <= auVar213._8_4_;
      uVar135 = -(uint)bVar30;
      bVar31 = 0.0 <= auVar213._12_4_;
      uVar137 = -(uint)bVar31;
      auVar336._0_4_ = auVar357._0_4_ + auVar357._0_4_;
      auVar336._4_4_ = auVar357._4_4_ + auVar357._4_4_;
      auVar336._8_4_ = auVar357._8_4_ + auVar357._8_4_;
      auVar336._12_4_ = auVar357._12_4_ + auVar357._12_4_;
      auVar248 = rcpps(auVar357,auVar336);
      fVar420 = auVar248._0_4_;
      fVar428 = auVar248._4_4_;
      fVar431 = auVar248._8_4_;
      fVar433 = auVar248._12_4_;
      fVar420 = (1.0 - auVar336._0_4_ * fVar420) * fVar420 + fVar420;
      fVar428 = (1.0 - auVar336._4_4_ * fVar428) * fVar428 + fVar428;
      fVar431 = (1.0 - auVar336._8_4_ * fVar431) * fVar431 + fVar431;
      fVar433 = (1.0 - auVar336._12_4_ * fVar433) * fVar433 + fVar433;
      fVar383 = (-auVar421._0_4_ - auVar356._0_4_) * fVar420;
      fVar393 = (-auVar421._4_4_ - auVar356._4_4_) * fVar428;
      fVar396 = (fStack_4f0 - auVar356._8_4_) * fVar431;
      fVar398 = (fStack_4ec - auVar356._12_4_) * fVar433;
      fVar420 = (auVar356._0_4_ - auVar421._0_4_) * fVar420;
      fVar428 = (auVar356._4_4_ - auVar421._4_4_) * fVar428;
      fVar431 = (auVar356._8_4_ - auVar421._8_4_) * fVar431;
      fVar433 = (auVar356._12_4_ - auVar421._12_4_) * fVar433;
      local_238 = (fVar330 * fVar383 + fVar435) * fVar363;
      fStack_234 = (fVar331 * fVar393 + fVar440) * fVar381;
      fStack_230 = (fVar332 * fVar396 + fVar442) * fVar394;
      fStack_22c = (fVar341 * fVar398 + fVar443) * fVar403;
      local_228 = (fVar330 * fVar420 + fVar435) * fVar363;
      fStack_224 = (fVar331 * fVar428 + fVar440) * fVar381;
      fStack_220 = (fVar332 * fVar431 + fVar442) * fVar394;
      fStack_21c = (fVar341 * fVar433 + fVar443) * fVar403;
      auVar388._0_4_ = (uint)fVar383 & uVar134;
      auVar388._4_4_ = (uint)fVar393 & uVar136;
      auVar388._8_4_ = (uint)fVar396 & uVar135;
      auVar388._12_4_ = (uint)fVar398 & uVar137;
      auVar412._0_8_ = CONCAT44(~uVar136,~uVar134) & 0x7f8000007f800000;
      auVar412._8_4_ = ~uVar135 & 0x7f800000;
      auVar412._12_4_ = ~uVar137 & 0x7f800000;
      auVar412 = auVar412 | auVar388;
      auVar422._0_4_ = (uint)fVar420 & uVar134;
      auVar422._4_4_ = (uint)fVar428 & uVar136;
      auVar422._8_4_ = (uint)fVar431 & uVar135;
      auVar422._12_4_ = (uint)fVar433 & uVar137;
      auVar358._0_8_ = CONCAT44(~uVar136,~uVar134) & 0xff800000ff800000;
      auVar358._8_4_ = ~uVar135 & 0xff800000;
      auVar358._12_4_ = ~uVar137 & 0xff800000;
      auVar358 = auVar358 | auVar422;
      auVar79._4_4_ = fStack_304;
      auVar79._0_4_ = local_308;
      auVar79._8_4_ = fStack_300;
      auVar79._12_4_ = fStack_2fc;
      auVar248 = maxps(auVar79,auVar374);
      fVar420 = auVar248._0_4_ * 1.9073486e-06;
      fVar428 = auVar248._4_4_ * 1.9073486e-06;
      fVar431 = auVar248._8_4_ * 1.9073486e-06;
      fVar433 = auVar248._12_4_ * 1.9073486e-06;
      auVar423._0_4_ = -(uint)(fVar418 < fVar420 && bVar131);
      auVar423._4_4_ = -(uint)(fVar434 < fVar428 && bVar29);
      auVar423._8_4_ = -(uint)(fVar312 < fVar431 && bVar30);
      auVar423._12_4_ = -(uint)(fVar329 < fVar433 && bVar31);
      iVar257 = movmskps(iVar257,auVar423);
      if (iVar257 != 0) {
        uVar134 = -(uint)(fVar379 <= 0.0);
        uVar136 = -(uint)(fVar380 <= 0.0);
        uVar135 = -(uint)(fVar382 <= 0.0);
        uVar137 = -(uint)(fVar392 <= 0.0);
        auVar321._0_4_ = (uVar134 & 0xff800000 | ~uVar134 & 0x7f800000) & auVar423._0_4_;
        auVar321._4_4_ = (uVar136 & 0xff800000 | ~uVar136 & 0x7f800000) & auVar423._4_4_;
        auVar321._8_4_ = (uVar135 & 0xff800000 | ~uVar135 & 0x7f800000) & auVar423._8_4_;
        auVar321._12_4_ = (uVar137 & 0xff800000 | ~uVar137 & 0x7f800000) & auVar423._12_4_;
        auVar402._0_4_ = ~auVar423._0_4_ & auVar412._0_4_;
        auVar402._4_4_ = ~auVar423._4_4_ & auVar412._4_4_;
        auVar402._8_4_ = ~auVar423._8_4_ & auVar412._8_4_;
        auVar402._12_4_ = ~auVar423._12_4_ & auVar412._12_4_;
        auVar413._0_4_ = (uVar134 & 0x7f800000 | ~uVar134 & 0xff800000) & auVar423._0_4_;
        auVar413._4_4_ = (uVar136 & 0x7f800000 | ~uVar136 & 0xff800000) & auVar423._4_4_;
        auVar413._8_4_ = (uVar135 & 0x7f800000 | ~uVar135 & 0xff800000) & auVar423._8_4_;
        auVar413._12_4_ = (uVar137 & 0x7f800000 | ~uVar137 & 0xff800000) & auVar423._12_4_;
        auVar424._0_4_ = ~auVar423._0_4_ & auVar358._0_4_;
        auVar424._4_4_ = ~auVar423._4_4_ & auVar358._4_4_;
        auVar424._8_4_ = ~auVar423._8_4_ & auVar358._8_4_;
        auVar424._12_4_ = ~auVar423._12_4_ & auVar358._12_4_;
        auVar320._4_4_ = -(uint)((fVar428 <= fVar434 || fVar380 <= 0.0) && bVar29);
        auVar320._0_4_ = -(uint)((fVar420 <= fVar418 || fVar379 <= 0.0) && bVar131);
        auVar320._8_4_ = -(uint)((fVar431 <= fVar312 || fVar382 <= 0.0) && bVar30);
        auVar320._12_4_ = -(uint)((fVar433 <= fVar329 || fVar392 <= 0.0) && bVar31);
        auVar358 = auVar424 | auVar413;
        auVar412 = auVar402 | auVar321;
      }
    }
    auVar322._0_4_ = (auVar320._0_4_ << 0x1f) >> 0x1f;
    auVar322._4_4_ = (auVar320._4_4_ << 0x1f) >> 0x1f;
    auVar322._8_4_ = (auVar320._8_4_ << 0x1f) >> 0x1f;
    auVar322._12_4_ = (auVar320._12_4_ << 0x1f) >> 0x1f;
    auVar322 = auVar322 & auVar211;
    iVar257 = movmskps(iVar257,auVar322);
    if (iVar257 != 0) {
      auVar162._0_4_ = (ray->super_RayK<1>).org.field_0.m128[3] - (float)local_328._0_4_;
      auVar162._4_4_ = auVar162._0_4_;
      auVar162._8_4_ = auVar162._0_4_;
      auVar162._12_4_ = auVar162._0_4_;
      auVar248 = maxps(auVar162,auVar412);
      auVar436._0_4_ = (ray->super_RayK<1>).tfar - (float)local_328._0_4_;
      auVar436._4_4_ = auVar436._0_4_;
      auVar436._8_4_ = auVar436._0_4_;
      auVar436._12_4_ = auVar436._0_4_;
      auVar437 = minps(auVar436,auVar358);
      auVar214._0_4_ = fVar407 * fVar258 + fVar364 * fVar259;
      auVar214._4_4_ = fVar426 * fVar258 + fVar367 * fVar259;
      auVar214._8_4_ = fVar439 * fVar258 + fVar369 * fVar259;
      auVar214._12_4_ = fVar314 * fVar258 + fVar372 * fVar259;
      auVar249._0_4_ = fVar395 * local_338 + auVar214._0_4_;
      auVar249._4_4_ = fVar397 * fStack_334 + auVar214._4_4_;
      auVar249._8_4_ = fVar416 * fStack_330 + auVar214._8_4_;
      auVar249._12_4_ = fVar417 * fStack_32c + auVar214._12_4_;
      auVar356 = rcpps(auVar214,auVar249);
      fVar379 = auVar356._0_4_;
      fVar380 = auVar356._4_4_;
      fVar382 = auVar356._8_4_;
      fVar392 = auVar356._12_4_;
      fVar407 = ((1.0 - auVar249._0_4_ * fVar379) * fVar379 + fVar379) *
                -(fVar352 * fVar395 + fVar409 * fVar407 + fVar342 * fVar364);
      fVar409 = ((1.0 - auVar249._4_4_ * fVar380) * fVar380 + fVar380) *
                -(fVar353 * fVar397 + fVar429 * fVar426 + fVar343 * fVar367);
      fVar429 = ((1.0 - auVar249._8_4_ * fVar382) * fVar382 + fVar382) *
                -(fVar370 * fVar416 + fVar441 * fVar439 + fVar345 * fVar369);
      fVar441 = ((1.0 - auVar249._12_4_ * fVar392) * fVar392 + fVar392) *
                -(fVar377 * fVar417 + fVar315 * fVar314 + fVar350 * fVar372);
      uVar134 = -(uint)(auVar249._0_4_ < 0.0 || ABS(auVar249._0_4_) < 1e-18);
      uVar136 = -(uint)(auVar249._4_4_ < 0.0 || ABS(auVar249._4_4_) < 1e-18);
      uVar135 = -(uint)(auVar249._8_4_ < 0.0 || ABS(auVar249._8_4_) < 1e-18);
      uVar137 = -(uint)(auVar249._12_4_ < 0.0 || ABS(auVar249._12_4_) < 1e-18);
      auVar281._0_8_ = CONCAT44(uVar136,uVar134) & 0xff800000ff800000;
      auVar281._8_4_ = uVar135 & 0xff800000;
      auVar281._12_4_ = uVar137 & 0xff800000;
      auVar215._0_4_ = ~uVar134 & (uint)fVar407;
      auVar215._4_4_ = ~uVar136 & (uint)fVar409;
      auVar215._8_4_ = ~uVar135 & (uint)fVar429;
      auVar215._12_4_ = ~uVar137 & (uint)fVar441;
      auVar248 = maxps(auVar248,auVar215 | auVar281);
      uVar134 = -(uint)(0.0 < auVar249._0_4_ || ABS(auVar249._0_4_) < 1e-18);
      uVar136 = -(uint)(0.0 < auVar249._4_4_ || ABS(auVar249._4_4_) < 1e-18);
      uVar135 = -(uint)(0.0 < auVar249._8_4_ || ABS(auVar249._8_4_) < 1e-18);
      uVar137 = -(uint)(0.0 < auVar249._12_4_ || ABS(auVar249._12_4_) < 1e-18);
      auVar216._0_8_ = CONCAT44(uVar136,uVar134) & 0x7f8000007f800000;
      auVar216._8_4_ = uVar135 & 0x7f800000;
      auVar216._12_4_ = uVar137 & 0x7f800000;
      auVar250._0_4_ = ~uVar134 & (uint)fVar407;
      auVar250._4_4_ = ~uVar136 & (uint)fVar409;
      auVar250._8_4_ = ~uVar135 & (uint)fVar429;
      auVar250._12_4_ = ~uVar137 & (uint)fVar441;
      auVar437 = minps(auVar437,auVar250 | auVar216);
      auVar282._0_4_ = (0.0 - fVar427) * -fVar426 + (0.0 - fVar405) * -fVar367;
      auVar282._4_4_ = (0.0 - fVar430) * -fVar439 + (0.0 - fVar408) * -fVar369;
      auVar282._8_4_ = (0.0 - fVar432) * -fVar314 + (0.0 - fVar410) * -fVar372;
      auVar282._12_4_ = 0x80000000;
      auVar251._0_4_ = -fVar397 * local_338 + -fVar426 * fVar258 + -fVar367 * fVar259;
      auVar251._4_4_ = -fVar416 * fStack_334 + -fVar439 * fVar258 + -fVar369 * fVar259;
      auVar251._8_4_ = -fVar417 * fStack_330 + -fVar314 * fVar258 + -fVar372 * fVar259;
      auVar251._12_4_ = fStack_32c * -0.0 + fVar258 * -0.0 + fVar259 * -0.0;
      auVar356 = rcpps(auVar282,auVar251);
      fVar407 = auVar356._0_4_;
      fVar409 = auVar356._4_4_;
      fVar426 = auVar356._8_4_;
      fVar429 = auVar356._12_4_;
      fVar407 = (((float)DAT_01f46a60 - auVar251._0_4_ * fVar407) * fVar407 + fVar407) *
                -((0.0 - fStack_4d4) * -fVar397 + auVar282._0_4_);
      fVar409 = ((DAT_01f46a60._4_4_ - auVar251._4_4_ * fVar409) * fVar409 + fVar409) *
                -((0.0 - fStack_4d0) * -fVar416 + auVar282._4_4_);
      fVar426 = ((DAT_01f46a60._8_4_ - auVar251._8_4_ * fVar426) * fVar426 + fVar426) *
                -((0.0 - fStack_4cc) * -fVar417 + auVar282._8_4_);
      fVar429 = ((DAT_01f46a60._12_4_ - auVar251._12_4_ * fVar429) * fVar429 + fVar429) * 0.0;
      uVar134 = -(uint)(auVar251._0_4_ < 0.0 || ABS(auVar251._0_4_) < 1e-18);
      uVar136 = -(uint)(auVar251._4_4_ < 0.0 || ABS(auVar251._4_4_) < 1e-18);
      uVar135 = -(uint)(auVar251._8_4_ < 0.0 || ABS(auVar251._8_4_) < 1e-18);
      uVar137 = -(uint)(auVar251._12_4_ < 0.0 || ABS(auVar251._12_4_) < 1e-18);
      auVar283._0_8_ = CONCAT44(uVar136,uVar134) & 0xff800000ff800000;
      auVar283._8_4_ = uVar135 & 0xff800000;
      auVar283._12_4_ = uVar137 & 0xff800000;
      auVar217._0_4_ = ~uVar134 & (uint)fVar407;
      auVar217._4_4_ = ~uVar136 & (uint)fVar409;
      auVar217._8_4_ = ~uVar135 & (uint)fVar426;
      auVar217._12_4_ = ~uVar137 & (uint)fVar429;
      auVar248 = maxps(auVar248,auVar217 | auVar283);
      uVar134 = -(uint)(0.0 < auVar251._0_4_ || ABS(auVar251._0_4_) < 1e-18);
      uVar136 = -(uint)(0.0 < auVar251._4_4_ || ABS(auVar251._4_4_) < 1e-18);
      uVar135 = -(uint)(0.0 < auVar251._8_4_ || ABS(auVar251._8_4_) < 1e-18);
      uVar137 = -(uint)(0.0 < auVar251._12_4_ || ABS(auVar251._12_4_) < 1e-18);
      auVar218._0_8_ = CONCAT44(uVar136,uVar134) & 0x7f8000007f800000;
      auVar218._8_4_ = uVar135 & 0x7f800000;
      auVar218._12_4_ = uVar137 & 0x7f800000;
      auVar252._0_4_ = ~uVar134 & (uint)fVar407;
      auVar252._4_4_ = ~uVar136 & (uint)fVar409;
      auVar252._8_4_ = ~uVar135 & (uint)fVar426;
      auVar252._12_4_ = ~uVar137 & (uint)fVar429;
      aVar438 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)minps(auVar437,auVar252 | auVar218);
      fVar407 = auVar248._12_4_;
      fVar409 = auVar248._0_4_;
      fVar426 = auVar248._4_4_;
      fVar429 = auVar248._8_4_;
      auVar414._0_4_ = -(uint)(fVar409 <= aVar438.v[0]) & auVar322._0_4_;
      auVar414._4_4_ = -(uint)(fVar426 <= aVar438.v[1]) & auVar322._4_4_;
      auVar414._8_4_ = -(uint)(fVar429 <= aVar438.v[2]) & auVar322._8_4_;
      auVar414._12_4_ = -(uint)(fVar407 <= aVar438.v[3]) & auVar322._12_4_;
      iVar257 = movmskps(iVar257,auVar414);
      if (iVar257 != 0) {
        auVar74._4_4_ = (auVar387._4_4_ - auVar333._4_4_) * 0.99999976;
        auVar74._0_4_ = (auVar387._0_4_ - auVar333._0_4_) * 0.99999976;
        auVar74._8_4_ = (auVar387._8_4_ - auVar333._8_4_) * 0.99999976;
        auVar74._12_4_ = (auVar387._12_4_ - auVar333._12_4_) * 0.99999976;
        auVar356 = maxps(ZEXT816(0),auVar74);
        auVar81._4_4_ = fStack_234;
        auVar81._0_4_ = local_238;
        auVar81._8_4_ = fStack_230;
        auVar81._12_4_ = fStack_22c;
        auVar333 = minps(auVar81,_DAT_01f46a60);
        auVar306._0_12_ = ZEXT812(0);
        auVar306._12_4_ = 0.0;
        auVar387 = maxps(auVar333,auVar306);
        auVar82._4_4_ = fStack_224;
        auVar82._0_4_ = local_228;
        auVar82._8_4_ = fStack_220;
        auVar82._12_4_ = fStack_21c;
        auVar333 = minps(auVar82,_DAT_01f46a60);
        auVar333 = maxps(auVar333,auVar306);
        local_108._0_4_ = (auVar387._0_4_ + 0.0) * 0.25 * fVar404 + fVar406;
        local_108._4_4_ = (auVar387._4_4_ + 1.0) * 0.25 * fVar404 + fVar406;
        local_108._8_4_ = (auVar387._8_4_ + 2.0) * 0.25 * fVar404 + fVar406;
        local_108._12_4_ = (auVar387._12_4_ + 3.0) * 0.25 * fVar404 + fVar406;
        local_118[0] = (auVar333._0_4_ + 0.0) * 0.25 * fVar404 + fVar406;
        local_118[1] = (auVar333._4_4_ + 1.0) * 0.25 * fVar404 + fVar406;
        local_118[2] = (auVar333._8_4_ + 2.0) * 0.25 * fVar404 + fVar406;
        local_118[3] = (auVar333._12_4_ + 3.0) * 0.25 * fVar404 + fVar406;
        fVar362 = fVar362 - auVar356._0_4_ * auVar356._0_4_;
        fVar378 = fVar378 - auVar356._4_4_ * auVar356._4_4_;
        fVar391 = fVar391 - auVar356._8_4_ * auVar356._8_4_;
        fVar399 = fVar399 - auVar356._12_4_ * auVar356._12_4_;
        auVar253._0_4_ = auVar357._0_4_ * 4.0 * fVar362;
        auVar253._4_4_ = auVar357._4_4_ * 4.0 * fVar378;
        auVar253._8_4_ = auVar357._8_4_ * 4.0 * fVar391;
        auVar253._12_4_ = auVar357._12_4_ * 4.0 * fVar399;
        auVar219._0_4_ = auVar421._0_4_ * auVar421._0_4_ - auVar253._0_4_;
        auVar219._4_4_ = auVar421._4_4_ * auVar421._4_4_ - auVar253._4_4_;
        auVar219._8_4_ = auVar421._8_4_ * auVar421._8_4_ - auVar253._8_4_;
        auVar219._12_4_ = auVar421._12_4_ * auVar421._12_4_ - auVar253._12_4_;
        auVar425._4_4_ = -(uint)(0.0 <= auVar219._4_4_);
        auVar425._0_4_ = -(uint)(0.0 <= auVar219._0_4_);
        auVar425._8_4_ = -(uint)(0.0 <= auVar219._8_4_);
        auVar425._12_4_ = -(uint)(0.0 <= auVar219._12_4_);
        iVar257 = movmskps(iVar257,auVar425);
        if (iVar257 == 0) {
          _local_5b8 = ZEXT816(0);
          fVar363 = 0.0;
          fVar381 = 0.0;
          fVar394 = 0.0;
          fVar403 = 0.0;
          fVar315 = 0.0;
          fVar342 = 0.0;
          fVar343 = 0.0;
          fVar345 = 0.0;
          fVar404 = 0.0;
          fVar439 = 0.0;
          fVar441 = 0.0;
          fVar314 = 0.0;
          _local_4f8 = ZEXT816(0);
          iVar257 = 0;
          auVar347 = _DAT_01f45a40;
          auVar359 = _DAT_01f45a30;
        }
        else {
          auVar356 = sqrtps(local_108,auVar219);
          auVar163._0_4_ = auVar357._0_4_ + auVar357._0_4_;
          auVar163._4_4_ = auVar357._4_4_ + auVar357._4_4_;
          auVar163._8_4_ = auVar357._8_4_ + auVar357._8_4_;
          auVar163._12_4_ = auVar357._12_4_ + auVar357._12_4_;
          auVar333 = rcpps(auVar253,auVar163);
          fVar350 = auVar333._0_4_;
          fVar352 = auVar333._4_4_;
          fVar353 = auVar333._8_4_;
          fVar364 = auVar333._12_4_;
          fVar350 = ((float)DAT_01f46a60 - auVar163._0_4_ * fVar350) * fVar350 + fVar350;
          fVar352 = (DAT_01f46a60._4_4_ - auVar163._4_4_ * fVar352) * fVar352 + fVar352;
          fVar353 = (DAT_01f46a60._8_4_ - auVar163._8_4_ * fVar353) * fVar353 + fVar353;
          fVar364 = (DAT_01f46a60._12_4_ - auVar163._12_4_ * fVar364) * fVar364 + fVar364;
          fVar377 = ((float)local_4f8._0_4_ - auVar356._0_4_) * fVar350;
          fVar379 = ((float)local_4f8._4_4_ - auVar356._4_4_) * fVar352;
          fVar380 = (fStack_4f0 - auVar356._8_4_) * fVar353;
          fVar382 = (fStack_4ec - auVar356._12_4_) * fVar364;
          fVar350 = (auVar356._0_4_ - auVar421._0_4_) * fVar350;
          fVar352 = (auVar356._4_4_ - auVar421._4_4_) * fVar352;
          fVar353 = (auVar356._8_4_ - auVar421._8_4_) * fVar353;
          fVar364 = (auVar356._12_4_ - auVar421._12_4_) * fVar364;
          fVar367 = (fVar330 * fVar377 + fVar435) * fVar363;
          fVar369 = (fVar331 * fVar379 + fVar440) * fVar381;
          fVar370 = (fVar332 * fVar380 + fVar442) * fVar394;
          fVar372 = (fVar341 * fVar382 + fVar443) * fVar403;
          fVar315 = local_338 * fVar377 - (local_368 * fVar367 + local_4d8);
          fVar342 = fStack_334 * fVar379 - (fStack_364 * fVar369 + fStack_4d4);
          fVar343 = fStack_330 * fVar380 - (fStack_360 * fVar370 + fStack_4d0);
          fVar345 = fStack_32c * fVar382 - (fStack_35c * fVar372 + fStack_4cc);
          fVar404 = fVar258 * fVar377 - ((float)local_348._0_4_ * fVar367 + fVar419);
          fVar439 = fVar258 * fVar379 - ((float)local_348._4_4_ * fVar369 + fVar427);
          fVar441 = fVar258 * fVar380 - (fStack_340 * fVar370 + fVar430);
          fVar314 = fVar258 * fVar382 - (fStack_33c * fVar372 + fVar432);
          local_4f8._4_4_ = fVar259 * fVar379 - (fVar369 * (float)local_358._4_4_ + fVar405);
          local_4f8._0_4_ = fVar259 * fVar377 - (fVar367 * (float)local_358._0_4_ + fVar400);
          fStack_4f0 = fVar259 * fVar380 - (fVar370 * fStack_350 + fVar408);
          fStack_4ec = fVar259 * fVar382 - (fVar372 * fStack_34c + fVar410);
          fVar363 = (fVar330 * fVar350 + fVar435) * fVar363;
          fVar381 = (fVar331 * fVar352 + fVar440) * fVar381;
          fVar394 = (fVar332 * fVar353 + fVar442) * fVar394;
          fVar403 = (fVar341 * fVar364 + fVar443) * fVar403;
          local_5b8._0_4_ = local_338 * fVar350 - (local_368 * fVar363 + local_4d8);
          local_5b8._4_4_ = fStack_334 * fVar352 - (fStack_364 * fVar381 + fStack_4d4);
          fStack_5b0 = fStack_330 * fVar353 - (fStack_360 * fVar394 + fStack_4d0);
          fStack_5ac = fStack_32c * fVar364 - (fStack_35c * fVar403 + fStack_4cc);
          auVar306._0_4_ = fVar258 * fVar350 - ((float)local_348._0_4_ * fVar363 + fVar419);
          auVar306._4_4_ = fVar258 * fVar352 - ((float)local_348._4_4_ * fVar381 + fVar427);
          auVar306._8_4_ = fVar258 * fVar353 - (fStack_340 * fVar394 + fVar430);
          auVar306._12_4_ = fVar258 * fVar364 - (fStack_33c * fVar403 + fVar432);
          bVar131 = 0.0 <= auVar219._0_4_;
          uVar134 = -(uint)bVar131;
          bVar29 = 0.0 <= auVar219._4_4_;
          uVar136 = -(uint)bVar29;
          bVar30 = 0.0 <= auVar219._8_4_;
          uVar135 = -(uint)bVar30;
          bVar31 = 0.0 <= auVar219._12_4_;
          uVar137 = -(uint)bVar31;
          fVar363 = fVar259 * fVar350 - (fVar363 * (float)local_358._0_4_ + fVar400);
          fVar381 = fVar259 * fVar352 - (fVar381 * (float)local_358._4_4_ + fVar405);
          fVar394 = fVar259 * fVar353 - (fVar394 * fStack_350 + fVar408);
          fVar403 = fVar259 * fVar364 - (fVar403 * fStack_34c + fVar410);
          auVar389._0_4_ = (uint)fVar377 & uVar134;
          auVar389._4_4_ = (uint)fVar379 & uVar136;
          auVar389._8_4_ = (uint)fVar380 & uVar135;
          auVar389._12_4_ = (uint)fVar382 & uVar137;
          auVar359._0_8_ = CONCAT44(~uVar136,~uVar134) & 0x7f8000007f800000;
          auVar359._8_4_ = ~uVar135 & 0x7f800000;
          auVar359._12_4_ = ~uVar137 & 0x7f800000;
          auVar359 = auVar359 | auVar389;
          auVar337._0_4_ = (uint)fVar350 & uVar134;
          auVar337._4_4_ = (uint)fVar352 & uVar136;
          auVar337._8_4_ = (uint)fVar353 & uVar135;
          auVar337._12_4_ = (uint)fVar364 & uVar137;
          auVar347._0_8_ = CONCAT44(~uVar136,~uVar134) & 0xff800000ff800000;
          auVar347._8_4_ = ~uVar135 & 0xff800000;
          auVar347._12_4_ = ~uVar137 & 0xff800000;
          auVar347 = auVar347 | auVar337;
          auVar80._4_4_ = fStack_304;
          auVar80._0_4_ = local_308;
          auVar80._8_4_ = fStack_300;
          auVar80._12_4_ = fStack_2fc;
          auVar333 = maxps(auVar80,auVar374);
          fVar330 = auVar333._0_4_ * 1.9073486e-06;
          fVar331 = auVar333._4_4_ * 1.9073486e-06;
          fVar332 = auVar333._8_4_ * 1.9073486e-06;
          fVar341 = auVar333._12_4_ * 1.9073486e-06;
          auVar338._0_4_ = -(uint)(fVar418 < fVar330 && bVar131);
          auVar338._4_4_ = -(uint)(fVar434 < fVar331 && bVar29);
          auVar338._8_4_ = -(uint)(fVar312 < fVar332 && bVar30);
          auVar338._12_4_ = -(uint)(fVar329 < fVar341 && bVar31);
          iVar257 = movmskps(iVar257,auVar338);
          if (iVar257 != 0) {
            uVar134 = -(uint)(fVar362 <= 0.0);
            uVar136 = -(uint)(fVar378 <= 0.0);
            uVar135 = -(uint)(fVar391 <= 0.0);
            uVar137 = -(uint)(fVar399 <= 0.0);
            auVar365._0_4_ = (uVar134 & 0xff800000 | ~uVar134 & (uint)DAT_01f45a30) & auVar338._0_4_
            ;
            auVar365._4_4_ = (uVar136 & 0xff800000 | ~uVar136 & DAT_01f45a30._4_4_) & auVar338._4_4_
            ;
            auVar365._8_4_ = (uVar135 & 0xff800000 | ~uVar135 & DAT_01f45a30._8_4_) & auVar338._8_4_
            ;
            auVar365._12_4_ =
                 (uVar137 & 0xff800000 | ~uVar137 & DAT_01f45a30._12_4_) & auVar338._12_4_;
            auVar375._0_4_ = ~auVar338._0_4_ & auVar359._0_4_;
            auVar375._4_4_ = ~auVar338._4_4_ & auVar359._4_4_;
            auVar375._8_4_ = ~auVar338._8_4_ & auVar359._8_4_;
            auVar375._12_4_ = ~auVar338._12_4_ & auVar359._12_4_;
            auVar359 = auVar375 | auVar365;
            auVar361._0_4_ = (uVar134 & (uint)DAT_01f45a30 | ~uVar134 & 0xff800000) & auVar338._0_4_
            ;
            auVar361._4_4_ = (uVar136 & DAT_01f45a30._4_4_ | ~uVar136 & 0xff800000) & auVar338._4_4_
            ;
            auVar361._8_4_ = (uVar135 & DAT_01f45a30._8_4_ | ~uVar135 & 0xff800000) & auVar338._8_4_
            ;
            auVar361._12_4_ =
                 (uVar137 & DAT_01f45a30._12_4_ | ~uVar137 & 0xff800000) & auVar338._12_4_;
            auVar339._0_4_ = ~auVar338._0_4_ & auVar347._0_4_;
            auVar339._4_4_ = ~auVar338._4_4_ & auVar347._4_4_;
            auVar339._8_4_ = ~auVar338._8_4_ & auVar347._8_4_;
            auVar339._12_4_ = ~auVar338._12_4_ & auVar347._12_4_;
            auVar347 = auVar339 | auVar361;
            auVar425._4_4_ = -(uint)((fVar331 <= fVar434 || fVar378 <= 0.0) && bVar29);
            auVar425._0_4_ = -(uint)((fVar330 <= fVar418 || fVar362 <= 0.0) && bVar131);
            auVar425._8_4_ = -(uint)((fVar332 <= fVar312 || fVar391 <= 0.0) && bVar30);
            auVar425._12_4_ = -(uint)((fVar341 <= fVar329 || fVar399 <= 0.0) && bVar31);
          }
        }
        fVar362 = (ray->super_RayK<1>).dir.field_0.m128[0];
        fVar378 = (ray->super_RayK<1>).dir.field_0.m128[1];
        fVar391 = (ray->super_RayK<1>).dir.field_0.m128[2];
        auVar333 = minps((undefined1  [16])aVar438,auVar359);
        aVar360 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)maxps(auVar248,auVar347);
        tp1.lower.field_0 = aVar360;
        tp1.upper.field_0 = aVar438;
        auVar348._0_4_ = -(uint)(fVar409 <= auVar333._0_4_) & auVar414._0_4_;
        auVar348._4_4_ = -(uint)(fVar426 <= auVar333._4_4_) & auVar414._4_4_;
        auVar348._8_4_ = -(uint)(fVar429 <= auVar333._8_4_) & auVar414._8_4_;
        auVar348._12_4_ = -(uint)(fVar407 <= auVar333._12_4_) & auVar414._12_4_;
        local_348 = (undefined1  [8])
                    CONCAT44(-(uint)(aVar360.v[1] <= aVar438.v[1]) & auVar414._4_4_,
                             -(uint)(aVar360.v[0] <= aVar438.v[0]) & auVar414._0_4_);
        fStack_340 = (float)(-(uint)(aVar360.v[2] <= aVar438.v[2]) & auVar414._8_4_);
        fStack_33c = (float)(-(uint)(aVar360.v[3] <= aVar438.v[3]) & auVar414._12_4_);
        auVar164._8_4_ = fStack_340;
        auVar164._0_8_ = local_348;
        auVar164._12_4_ = fStack_33c;
        iVar257 = movmskps(iVar257,auVar164 | auVar348);
        pRVar121 = (RTCRayN *)CONCAT44((int)((ulong)pSVar120 >> 0x20),iVar257);
        if (iVar257 != 0) {
          local_368 = local_61c;
          fStack_364 = local_61c;
          fStack_360 = local_61c;
          fStack_35c = local_61c;
          local_4f8._0_4_ =
               -(uint)((int)local_61c <
                      ((int)((-(uint)(0.3 <= ABS((float)local_4f8._0_4_ * fVar391 +
                                                 fVar404 * fVar378 + fVar315 * fVar362)) &
                             auVar425._0_4_) << 0x1f) >> 0x1f) + 4);
          local_4f8._4_4_ =
               -(uint)((int)local_61c <
                      ((int)((-(uint)(0.3 <= ABS((float)local_4f8._4_4_ * fVar391 +
                                                 fVar439 * fVar378 + fVar342 * fVar362)) &
                             auVar425._4_4_) << 0x1f) >> 0x1f) + 4);
          fStack_4f0 = (float)-(uint)((int)local_61c <
                                     ((int)((-(uint)(0.3 <= ABS(fStack_4f0 * fVar391 +
                                                                fVar441 * fVar378 +
                                                                fVar343 * fVar362)) & auVar425._8_4_
                                            ) << 0x1f) >> 0x1f) + 4);
          fStack_4ec = (float)-(uint)((int)local_61c <
                                     ((int)((-(uint)(0.3 <= ABS(fStack_4ec * fVar391 +
                                                                fVar314 * fVar378 +
                                                                fVar345 * fVar362)) &
                                            auVar425._12_4_) << 0x1f) >> 0x1f) + 4);
          auVar165 = ~_local_4f8 & auVar348;
          fVar399 = local_4e8 + fVar409;
          fVar404 = fStack_4e4 + fVar426;
          fVar418 = fStack_4e0 + fVar429;
          fVar434 = fStack_4dc + fVar407;
          _local_358 = auVar348;
          while( true ) {
            vVar117.field_0 = tp1.lower.field_0;
            uStack_582 = (undefined2)((uint)fVar233 >> 0x10);
            uStack_584 = SUB42(fVar233,0);
            local_2e8 = auVar165;
            uVar123 = (undefined4)((ulong)pRVar121 >> 0x20);
            iVar257 = movmskps((int)pRVar121,auVar165);
            pRVar121 = (RTCRayN *)CONCAT44(uVar123,iVar257);
            if (iVar257 == 0) break;
            uVar134 = auVar165._0_4_;
            uVar136 = auVar165._4_4_;
            uVar135 = auVar165._8_4_;
            uVar137 = auVar165._12_4_;
            auVar220._0_4_ = uVar134 & (uint)fVar409;
            auVar220._4_4_ = uVar136 & (uint)fVar426;
            auVar220._8_4_ = uVar135 & (uint)fVar429;
            auVar220._12_4_ = uVar137 & (uint)fVar407;
            auVar254._0_8_ = CONCAT44(~uVar136,~uVar134) & 0x7f8000007f800000;
            auVar254._8_4_ = ~uVar135 & 0x7f800000;
            auVar254._12_4_ = ~uVar137 & 0x7f800000;
            auVar254 = auVar254 | auVar220;
            auVar284._4_4_ = auVar254._0_4_;
            auVar284._0_4_ = auVar254._4_4_;
            auVar284._8_4_ = auVar254._12_4_;
            auVar284._12_4_ = auVar254._8_4_;
            auVar333 = minps(auVar284,auVar254);
            auVar221._0_8_ = auVar333._8_8_;
            auVar221._8_4_ = auVar333._0_4_;
            auVar221._12_4_ = auVar333._4_4_;
            auVar333 = minps(auVar221,auVar333);
            auVar222._0_8_ =
                 CONCAT44(-(uint)(auVar333._4_4_ == auVar254._4_4_) & uVar136,
                          -(uint)(auVar333._0_4_ == auVar254._0_4_) & uVar134);
            auVar222._8_4_ = -(uint)(auVar333._8_4_ == auVar254._8_4_) & uVar135;
            auVar222._12_4_ = -(uint)(auVar333._12_4_ == auVar254._12_4_) & uVar137;
            iVar257 = movmskps(iVar257,auVar222);
            if (iVar257 != 0) {
              auVar165._8_4_ = auVar222._8_4_;
              auVar165._0_8_ = auVar222._0_8_;
              auVar165._12_4_ = auVar222._12_4_;
            }
            uVar118 = movmskps(iVar257,auVar165);
            uVar122 = CONCAT44(uVar123,uVar118);
            pRVar121 = (RTCRayN *)0x0;
            if (uVar122 != 0) {
              for (; (uVar122 >> (long)pRVar121 & 1) == 0; pRVar121 = pRVar121 + 1) {
              }
            }
            *(undefined4 *)(local_2e8 + (long)pRVar121 * 4) = 0;
            fVar439 = (ray->super_RayK<1>).dir.field_0.m128[0];
            fVar441 = (ray->super_RayK<1>).dir.field_0.m128[1];
            fVar312 = (ray->super_RayK<1>).dir.field_0.m128[2];
            fVar314 = (ray->super_RayK<1>).dir.field_0.m128[3];
            auVar72._4_2_ = uStack_584;
            auVar72._0_4_ = fVar313;
            auVar72._6_2_ = uStack_582;
            auVar72._8_4_ = fVar328;
            auVar72._12_4_ = fVar294;
            auVar248 = minps(auVar72,_local_4c8);
            auVar356 = maxps(auVar72,_local_4c8);
            auVar77._4_4_ = fVar344;
            auVar77._0_4_ = fVar340;
            auVar77._8_4_ = fVar349;
            auVar77._12_4_ = fVar295;
            auVar333 = minps(auVar77,_local_5f8);
            auVar248 = minps(auVar248,auVar333);
            auVar333 = maxps(auVar77,_local_5f8);
            auVar356 = maxps(auVar356,auVar333);
            auVar285._0_8_ = auVar248._0_8_ & 0x7fffffff7fffffff;
            auVar285._8_4_ = auVar248._8_4_ & 0x7fffffff;
            auVar285._12_4_ = auVar248._12_4_ & 0x7fffffff;
            auVar166._0_8_ = auVar356._0_8_ & 0x7fffffff7fffffff;
            auVar166._8_4_ = auVar356._8_4_ & 0x7fffffff;
            auVar166._12_4_ = ABS(auVar356._12_4_);
            auVar333 = maxps(auVar285,auVar166);
            fVar315 = auVar333._4_4_;
            if (auVar333._4_4_ <= auVar333._0_4_) {
              fVar315 = auVar333._0_4_;
            }
            auVar286._8_8_ = auVar333._8_8_;
            auVar286._0_8_ = auVar333._8_8_;
            if (auVar333._8_4_ <= fVar315) {
              auVar286._0_4_ = fVar315;
            }
            fVar330 = auVar286._0_4_ * 1.9073486e-06;
            fVar315 = *(float *)(local_108 + (long)pRVar121 * 4);
            fVar329 = local_118[(long)(pRVar121 + -8)];
            lVar129 = 5;
            do {
              bVar131 = lVar129 == 0;
              lVar129 = lVar129 + -1;
              if (bVar131) goto LAB_00356c64;
              fVar343 = SQRT(fVar312 * fVar312 + fVar441 * fVar441 + fVar439 * fVar439) *
                        1.9073486e-06 * fVar329;
              fVar331 = 1.0 - fVar315;
              fVar341 = (float)local_4c8._0_4_ * fVar331 + fVar340 * fVar315;
              fVar342 = (float)local_4c8._4_4_ * fVar331 + fVar344 * fVar315;
              fVar345 = fStack_4c0 * fVar331 + fVar349 * fVar315;
              fVar352 = fStack_4bc * fVar331 + fVar295 * fVar315;
              fVar350 = (fVar313 * fVar331 + (float)local_4c8._0_4_ * fVar315) * fVar331 +
                        fVar315 * fVar341;
              fVar353 = (fVar233 * fVar331 + (float)local_4c8._4_4_ * fVar315) * fVar331 +
                        fVar315 * fVar342;
              fVar364 = (fVar328 * fVar331 + fStack_4c0 * fVar315) * fVar331 + fVar315 * fVar345;
              fVar332 = (fVar294 * fVar331 + fStack_4bc * fVar315) * fVar331 + fVar315 * fVar352;
              fVar370 = fVar341 * fVar331 +
                        (fVar340 * fVar331 + (float)local_5f8._0_4_ * fVar315) * fVar315;
              fVar372 = fVar342 * fVar331 +
                        (fVar344 * fVar331 + (float)local_5f8._4_4_ * fVar315) * fVar315;
              fVar377 = fVar345 * fVar331 + (fVar349 * fVar331 + fStack_5f0 * fVar315) * fVar315;
              fVar341 = fVar352 * fVar331 + (fVar295 * fVar331 + fStack_5ec * fVar315) * fVar315;
              fVar369 = fVar331 * fVar332 + fVar315 * fVar341;
              local_4d8 = (fVar370 - fVar350) * 3.0;
              fStack_4d4 = (fVar372 - fVar353) * 3.0;
              fStack_4d0 = (fVar377 - fVar364) * 3.0;
              fStack_4cc = (fVar341 - fVar332) * 3.0;
              fVar332 = fVar331 * 6.0;
              fVar352 = (fVar315 - (fVar331 + fVar331)) * 6.0;
              fVar367 = (fVar331 - (fVar315 + fVar315)) * 6.0;
              fVar345 = fVar315 * 6.0;
              fVar341 = fVar332 * fVar313 +
                        fVar352 * (float)local_4c8._0_4_ +
                        fVar367 * fVar340 + fVar345 * (float)local_5f8._0_4_;
              fVar342 = fVar332 * fVar233 +
                        fVar352 * (float)local_4c8._4_4_ +
                        fVar367 * fVar344 + fVar345 * (float)local_5f8._4_4_;
              fVar332 = fVar332 * fVar328 +
                        fVar352 * fStack_4c0 + fVar367 * fVar349 + fVar345 * fStack_5f0;
              fVar352 = (fVar329 * fVar439 + 0.0) - (fVar331 * fVar350 + fVar315 * fVar370);
              fVar353 = (fVar329 * fVar441 + 0.0) - (fVar331 * fVar353 + fVar315 * fVar372);
              fVar364 = (fVar329 * fVar312 + 0.0) - (fVar331 * fVar364 + fVar315 * fVar377);
              fVar372 = (fVar329 * fVar314 + 0.0) - fVar369;
              fVar331 = fVar353 * fVar353;
              fVar345 = fVar364 * fVar364;
              fVar350 = fVar372 * fVar372;
              fVar367 = fVar331 + fVar352 * fVar352 + fVar345;
              fVar370 = fVar331 + fVar331 + fVar350;
              fVar345 = fVar331 + fVar345 + fVar345;
              fVar350 = fVar331 + fVar350 + fVar350;
              fVar331 = fVar330;
              if (fVar330 <= fVar343) {
                fVar331 = fVar343;
              }
              fVar410 = -local_4d8;
              fVar416 = -fStack_4d4;
              fVar417 = -fStack_4d0;
              fVar377 = fStack_4d4 * fStack_4d4 + local_4d8 * local_4d8 + fStack_4d0 * fStack_4d0;
              auVar248 = ZEXT416((uint)fVar377);
              auVar333 = rsqrtss(ZEXT416((uint)fVar377),auVar248);
              fVar343 = auVar333._0_4_;
              fVar379 = fVar343 * 1.5 - fVar343 * fVar343 * fVar377 * 0.5 * fVar343;
              fVar395 = local_4d8 * fVar379;
              fVar397 = fStack_4d4 * fVar379;
              fVar400 = fStack_4d0 * fVar379;
              fVar405 = fStack_4cc * fVar379;
              fVar408 = fStack_4d0 * fVar332 + fStack_4d4 * fVar342 + local_4d8 * fVar341;
              auVar333 = rcpss(auVar248,auVar248);
              fVar343 = (2.0 - fVar377 * auVar333._0_4_) * auVar333._0_4_;
              fVar380 = fVar353 * fVar397;
              fVar382 = fVar364 * fVar400;
              fVar392 = fVar372 * fVar405;
              fVar420 = fVar380 + fVar352 * fVar395 + fVar382;
              fVar427 = fVar380 + fVar380 + fVar392;
              fVar382 = fVar380 + fVar382 + fVar382;
              fVar392 = fVar380 + fVar392 + fVar392;
              fVar419 = (SQRT(fVar367) + 1.0) * (fVar330 / SQRT(fVar377)) +
                        SQRT(fVar367) * fVar330 + fVar331;
              fVar380 = fVar405 * -fStack_4cc;
              fVar342 = fVar400 * fVar417 + fVar397 * fVar416 + fVar395 * fVar410 +
                        fVar343 * (fVar377 * fVar332 - fVar408 * fStack_4d0) * fVar379 * fVar364 +
                        fVar343 * (fVar377 * fVar342 - fVar408 * fStack_4d4) * fVar379 * fVar353 +
                        fVar343 * (fVar377 * fVar341 - fVar408 * local_4d8) * fVar379 * fVar352;
              fVar377 = fVar312 * fVar400 + fVar441 * fVar397 + fVar439 * fVar395;
              fVar332 = fVar367 - fVar420 * fVar420;
              auVar390._0_8_ = CONCAT44(fVar370 - fVar427 * fVar427,fVar332);
              auVar390._8_4_ = fVar345 - fVar382 * fVar382;
              auVar390._12_4_ = fVar350 - fVar392 * fVar392;
              fVar343 = -fStack_4cc * fVar372;
              local_3b8 = CONCAT44(fVar380,fVar342);
              auVar223._8_4_ = auVar390._8_4_;
              auVar223._0_8_ = auVar390._0_8_;
              auVar223._12_4_ = auVar390._12_4_;
              auVar333 = rsqrtss(auVar223,auVar390);
              fVar341 = auVar333._0_4_;
              fVar341 = fVar341 * 1.5 - fVar341 * fVar341 * fVar332 * 0.5 * fVar341;
              if (fVar332 < 0.0) {
                fVar332 = sqrtf(fVar332);
                pRVar121 = extraout_RAX;
                pRVar126 = extraout_RDX;
              }
              else {
                fVar332 = SQRT(fVar332);
              }
              fVar332 = fVar332 - fVar369;
              fVar369 = ((fVar417 * fVar364 + fVar416 * fVar353 + fVar410 * fVar352) -
                        fVar420 * fVar342) * fVar341 - fStack_4cc;
              fVar341 = ((fVar312 * fVar364 + fVar441 * fVar353 + fVar439 * fVar352) -
                        fVar420 * fVar377) * fVar341;
              auVar287._0_4_ = fVar342 * fVar341 - fVar377 * fVar369;
              auVar308._8_4_ = -fVar343;
              auVar308._0_8_ = CONCAT44(fVar343,fVar369) ^ 0x8000000000000000;
              auVar308._12_4_ = fVar314 * fVar372;
              auVar307._8_8_ = auVar308._8_8_;
              auVar307._0_8_ = CONCAT44(fVar341,fVar369) ^ 0x80000000;
              auVar287._4_4_ = auVar287._0_4_;
              auVar287._8_4_ = auVar287._0_4_;
              auVar287._12_4_ = auVar287._0_4_;
              auVar333 = divps(auVar307,auVar287);
              auVar324._8_4_ = fVar380;
              auVar324._0_8_ = local_3b8;
              auVar324._12_4_ = -(fVar314 * fVar405);
              auVar323._8_8_ = auVar324._8_8_;
              auVar323._0_8_ = CONCAT44(fVar377,fVar342) ^ 0x8000000000000000;
              auVar248 = divps(auVar323,auVar287);
              fVar329 = fVar329 - (fVar332 * auVar248._0_4_ + fVar420 * auVar333._0_4_);
              fVar315 = fVar315 - (fVar332 * auVar248._4_4_ + fVar420 * auVar333._4_4_);
            } while ((fVar419 <= ABS(fVar420)) ||
                    (auVar356._12_4_ * 1.9073486e-06 + fVar331 + fVar419 <= ABS(fVar332)));
            fVar329 = local_328._0_4_ + fVar329;
            if (((ray->super_RayK<1>).org.field_0.m128[3] <= fVar329) &&
               (((fVar439 = (ray->super_RayK<1>).tfar, fVar329 <= fVar439 && (0.0 <= fVar315)) &&
                (fVar315 <= 1.0)))) {
              auVar75._4_4_ = fVar370;
              auVar75._0_4_ = fVar367;
              auVar75._8_4_ = fVar345;
              auVar75._12_4_ = fVar350;
              auVar333 = rsqrtss(auVar75,auVar75);
              fVar441 = auVar333._0_4_;
              pGVar26 = (context->scene->geometries).items[uVar132].ptr;
              uVar134 = (ray->super_RayK<1>).mask;
              pRVar121 = (RTCRayN *)(ulong)uVar134;
              if ((pGVar26->mask & uVar134) != 0) {
                fVar441 = fVar441 * 1.5 + fVar441 * fVar441 * fVar367 * -0.5 * fVar441;
                fVar352 = fVar352 * fVar441;
                fVar353 = fVar353 * fVar441;
                fVar364 = fVar364 * fVar441;
                fVar441 = fStack_4cc * fVar352 + local_4d8;
                fVar312 = fStack_4cc * fVar353 + fStack_4d4;
                fVar314 = fStack_4cc * fVar364 + fStack_4d0;
                fVar331 = fVar353 * local_4d8 - fStack_4d4 * fVar352;
                fVar332 = fVar364 * fStack_4d4 - fStack_4d0 * fVar353;
                fVar341 = fVar352 * fStack_4d0 - local_4d8 * fVar364;
                fVar330 = fVar312 * fVar332 - fVar341 * fVar441;
                uVar182 = CONCAT44(fVar441 * fVar331 - fVar332 * fVar314,
                                   fVar314 * fVar341 - fVar331 * fVar312);
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar26->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  (ray->super_RayK<1>).tfar = fVar329;
                  *(undefined8 *)&(ray->Ng).field_0 = uVar182;
                  (ray->Ng).field_0.field_0.z = fVar330;
                  ray->u = fVar315;
                  ray->v = 0.0;
                  ray->primID = uVar133;
                  ray->geomID = uVar132;
                  ray->instID[0] = context->user->instID[0];
                  uVar134 = context->user->instPrimID[0];
                  ray->instPrimID[0] = uVar134;
                  pRVar121 = (RTCRayN *)(ulong)uVar134;
                }
                else {
                  vu0.field_0._0_8_ = uVar182;
                  vu0.field_0.v[2] = fVar330;
                  vu0.field_0.v[3] = fVar315;
                  pRVar124 = (RTCIntersectArguments *)(ulong)context->user->instID[0];
                  (ray->super_RayK<1>).tfar = fVar329;
                  local_378._0_4_ = 0xffffffff;
                  args.geometryUserPtr = pGVar26->userPtr;
                  args.valid = (int *)local_378;
                  args.context = context->user;
                  args.hit = (RTCHitN *)&vu0;
                  args.N = 1;
                  args.ray = (RTCRayN *)ray;
                  if (pGVar26->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00356d6b:
                    pRVar124 = context->args;
                    if ((pRVar124->filter != (RTCFilterFunctionN)0x0) &&
                       (((pRVar124->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar26->field_8).field_0x2 & 0x40) != 0)))) {
                      (*pRVar124->filter)(&args);
                      pRVar126 = extraout_RDX_01;
                      if (*args.valid == 0) goto LAB_00356dfa;
                    }
                    *(undefined4 *)(args.ray + 0x30) = *(undefined4 *)args.hit;
                    *(undefined4 *)(args.ray + 0x34) = *(undefined4 *)(args.hit + 4);
                    *(undefined4 *)(args.ray + 0x38) = *(undefined4 *)(args.hit + 8);
                    *(undefined4 *)(args.ray + 0x3c) = *(undefined4 *)(args.hit + 0xc);
                    *(undefined4 *)(args.ray + 0x40) = *(undefined4 *)(args.hit + 0x10);
                    *(undefined4 *)(args.ray + 0x44) = *(undefined4 *)(args.hit + 0x14);
                    *(undefined4 *)(args.ray + 0x48) = *(undefined4 *)(args.hit + 0x18);
                    pRVar126 = (RTCIntersectArguments *)(ulong)*(uint *)(args.hit + 0x1c);
                    *(uint *)(args.ray + 0x4c) = *(uint *)(args.hit + 0x1c);
                    pRVar124 = (RTCIntersectArguments *)(ulong)*(uint *)(args.hit + 0x20);
                    *(uint *)(args.ray + 0x50) = *(uint *)(args.hit + 0x20);
                    pRVar121 = args.ray;
                  }
                  else {
                    (*pGVar26->intersectionFilterN)(&args);
                    pRVar126 = extraout_RDX_00;
                    if (*args.valid != 0) goto LAB_00356d6b;
LAB_00356dfa:
                    (ray->super_RayK<1>).tfar = fVar439;
                    pRVar121 = (RTCRayN *)args.valid;
                  }
                }
              }
            }
LAB_00356c64:
            fVar439 = (ray->super_RayK<1>).tfar;
            auVar165._0_4_ = -(uint)(fVar399 <= fVar439) & local_2e8._0_4_;
            auVar165._4_4_ = -(uint)(fVar404 <= fVar439) & local_2e8._4_4_;
            auVar165._8_4_ = -(uint)(fVar418 <= fVar439) & local_2e8._8_4_;
            auVar165._12_4_ = -(uint)(fVar434 <= fVar439) & local_2e8._12_4_;
          }
          fVar399 = (ray->super_RayK<1>).tfar;
          auVar288._0_4_ = -(uint)(aVar360.v[0] + local_4e8 <= fVar399) & local_348._0_4_;
          auVar288._4_4_ = -(uint)(aVar360.v[1] + fStack_4e4 <= fVar399) & local_348._4_4_;
          auVar288._8_4_ = -(uint)(aVar360.v[2] + fStack_4e0 <= fVar399) & (uint)fStack_340;
          auVar288._12_4_ = -(uint)(aVar360.v[3] + fStack_4dc <= fVar399) & (uint)fStack_33c;
          auVar224._0_4_ =
               -(uint)((int)local_368 <
                      ((int)((-(uint)(0.3 <= ABS((float)local_5b8._0_4_ * fVar362 +
                                                 auVar306._0_4_ * fVar378 + fVar363 * fVar391)) &
                             auVar425._0_4_) << 0x1f) >> 0x1f) + 4);
          auVar224._4_4_ =
               -(uint)((int)fStack_364 <
                      ((int)((-(uint)(0.3 <= ABS((float)local_5b8._4_4_ * fVar362 +
                                                 auVar306._4_4_ * fVar378 + fVar381 * fVar391)) &
                             auVar425._4_4_) << 0x1f) >> 0x1f) + 4);
          auVar224._8_4_ =
               -(uint)((int)fStack_360 <
                      ((int)((-(uint)(0.3 <= ABS(fStack_5b0 * fVar362 +
                                                 auVar306._8_4_ * fVar378 + fVar394 * fVar391)) &
                             auVar425._8_4_) << 0x1f) >> 0x1f) + 4);
          auVar224._12_4_ =
               -(uint)((int)fStack_35c <
                      ((int)((-(uint)(0.3 <= ABS(fStack_5ac * fVar362 +
                                                 auVar306._12_4_ * fVar378 + fVar403 * fVar391)) &
                             auVar425._12_4_) << 0x1f) >> 0x1f) + 4);
          auVar225 = ~auVar224 & auVar288;
          fVar362 = local_4e8 + tp1.lower.field_0.v[0];
          fVar363 = fStack_4e4 + tp1.lower.field_0.v[1];
          fVar378 = fStack_4e0 + tp1.lower.field_0.v[2];
          fVar381 = fStack_4dc + tp1.lower.field_0.v[3];
          while( true ) {
            local_378 = auVar225;
            iVar257 = movmskps((int)pRVar121,auVar225);
            if (iVar257 == 0) break;
            auVar248 = ~auVar225 & _DAT_01f45a30 | auVar225 & (undefined1  [16])vVar117.field_0;
            auVar289._4_4_ = auVar248._0_4_;
            auVar289._0_4_ = auVar248._4_4_;
            auVar289._8_4_ = auVar248._12_4_;
            auVar289._12_4_ = auVar248._8_4_;
            auVar333 = minps(auVar289,auVar248);
            auVar167._0_8_ = auVar333._8_8_;
            auVar167._8_4_ = auVar333._0_4_;
            auVar167._12_4_ = auVar333._4_4_;
            auVar333 = minps(auVar167,auVar333);
            auVar168._0_8_ =
                 CONCAT44(-(uint)(auVar333._4_4_ == auVar248._4_4_) & auVar225._4_4_,
                          -(uint)(auVar333._0_4_ == auVar248._0_4_) & auVar225._0_4_);
            auVar168._8_4_ = -(uint)(auVar333._8_4_ == auVar248._8_4_) & auVar225._8_4_;
            auVar168._12_4_ = -(uint)(auVar333._12_4_ == auVar248._12_4_) & auVar225._12_4_;
            iVar257 = movmskps(iVar257,auVar168);
            if (iVar257 != 0) {
              auVar225._8_4_ = auVar168._8_4_;
              auVar225._0_8_ = auVar168._0_8_;
              auVar225._12_4_ = auVar168._12_4_;
            }
            uVar123 = movmskps(iVar257,auVar225);
            uVar122 = CONCAT44((int)((ulong)pRVar121 >> 0x20),uVar123);
            pRVar121 = (RTCRayN *)0x0;
            if (uVar122 != 0) {
              for (; (uVar122 >> (long)pRVar121 & 1) == 0; pRVar121 = pRVar121 + 1) {
              }
            }
            *(undefined4 *)(local_378 + (long)pRVar121 * 4) = 0;
            fVar391 = (ray->super_RayK<1>).dir.field_0.m128[0];
            fVar394 = (ray->super_RayK<1>).dir.field_0.m128[1];
            fVar399 = (ray->super_RayK<1>).dir.field_0.m128[2];
            fVar403 = (ray->super_RayK<1>).dir.field_0.m128[3];
            auVar73._4_2_ = uStack_584;
            auVar73._0_4_ = fVar313;
            auVar73._6_2_ = uStack_582;
            auVar73._8_4_ = fVar328;
            auVar73._12_4_ = fVar294;
            auVar248 = minps(auVar73,_local_4c8);
            auVar356 = maxps(auVar73,_local_4c8);
            auVar78._4_4_ = fVar344;
            auVar78._0_4_ = fVar340;
            auVar78._8_4_ = fVar349;
            auVar78._12_4_ = fVar295;
            auVar333 = minps(auVar78,_local_5f8);
            auVar248 = minps(auVar248,auVar333);
            auVar333 = maxps(auVar78,_local_5f8);
            auVar356 = maxps(auVar356,auVar333);
            auVar290._0_8_ = auVar248._0_8_ & 0x7fffffff7fffffff;
            auVar290._8_4_ = auVar248._8_4_ & 0x7fffffff;
            auVar290._12_4_ = auVar248._12_4_ & 0x7fffffff;
            auVar169._0_8_ = auVar356._0_8_ & 0x7fffffff7fffffff;
            auVar169._8_4_ = auVar356._8_4_ & 0x7fffffff;
            auVar169._12_4_ = ABS(auVar356._12_4_);
            auVar333 = maxps(auVar290,auVar169);
            fVar404 = auVar333._4_4_;
            if (auVar333._4_4_ <= auVar333._0_4_) {
              fVar404 = auVar333._0_4_;
            }
            auVar291._8_8_ = auVar333._8_8_;
            auVar291._0_8_ = auVar333._8_8_;
            if (auVar333._8_4_ <= fVar404) {
              auVar291._0_4_ = fVar404;
            }
            fVar434 = auVar291._0_4_ * 1.9073486e-06;
            fVar404 = local_118[(long)pRVar121];
            fVar418 = tp1.upper.field_0.v[(long)pRVar121];
            lVar129 = 5;
            do {
              bVar131 = lVar129 == 0;
              lVar129 = lVar129 + -1;
              if (bVar131) goto LAB_0035760c;
              fVar315 = SQRT(fVar399 * fVar399 + fVar394 * fVar394 + fVar391 * fVar391) *
                        1.9073486e-06 * fVar418;
              fVar439 = 1.0 - fVar404;
              fVar312 = (float)local_4c8._0_4_ * fVar439 + fVar340 * fVar404;
              fVar314 = (float)local_4c8._4_4_ * fVar439 + fVar344 * fVar404;
              fVar329 = fStack_4c0 * fVar439 + fVar349 * fVar404;
              fVar331 = fStack_4bc * fVar439 + fVar295 * fVar404;
              fVar330 = (fVar313 * fVar439 + (float)local_4c8._0_4_ * fVar404) * fVar439 +
                        fVar404 * fVar312;
              fVar332 = (fVar233 * fVar439 + (float)local_4c8._4_4_ * fVar404) * fVar439 +
                        fVar404 * fVar314;
              fVar341 = (fVar328 * fVar439 + fStack_4c0 * fVar404) * fVar439 + fVar404 * fVar329;
              fVar441 = (fVar294 * fVar439 + fStack_4bc * fVar404) * fVar439 + fVar404 * fVar331;
              fVar343 = fVar312 * fVar439 +
                        (fVar340 * fVar439 + (float)local_5f8._0_4_ * fVar404) * fVar404;
              fVar345 = fVar314 * fVar439 +
                        (fVar344 * fVar439 + (float)local_5f8._4_4_ * fVar404) * fVar404;
              fVar350 = fVar329 * fVar439 + (fVar349 * fVar439 + fStack_5f0 * fVar404) * fVar404;
              fVar312 = fVar331 * fVar439 + (fVar295 * fVar439 + fStack_5ec * fVar404) * fVar404;
              fVar352 = fVar439 * fVar441 + fVar404 * fVar312;
              local_4d8 = (fVar343 - fVar330) * 3.0;
              fStack_4d4 = (fVar345 - fVar332) * 3.0;
              fStack_4d0 = (fVar350 - fVar341) * 3.0;
              fStack_4cc = (fVar312 - fVar441) * 3.0;
              fVar441 = fVar439 * 6.0;
              fVar331 = (fVar404 - (fVar439 + fVar439)) * 6.0;
              fVar342 = (fVar439 - (fVar404 + fVar404)) * 6.0;
              fVar329 = fVar404 * 6.0;
              fVar312 = fVar441 * fVar313 +
                        fVar331 * (float)local_4c8._0_4_ +
                        fVar342 * fVar340 + fVar329 * (float)local_5f8._0_4_;
              fVar314 = fVar441 * fVar233 +
                        fVar331 * (float)local_4c8._4_4_ +
                        fVar342 * fVar344 + fVar329 * (float)local_5f8._4_4_;
              fVar441 = fVar441 * fVar328 +
                        fVar331 * fStack_4c0 + fVar342 * fVar349 + fVar329 * fStack_5f0;
              fVar331 = (fVar418 * fVar391 + 0.0) - (fVar439 * fVar330 + fVar404 * fVar343);
              fVar332 = (fVar418 * fVar394 + 0.0) - (fVar439 * fVar332 + fVar404 * fVar345);
              fVar341 = (fVar418 * fVar399 + 0.0) - (fVar439 * fVar341 + fVar404 * fVar350);
              fVar342 = (fVar418 * fVar403 + 0.0) - fVar352;
              fVar439 = fVar332 * fVar332;
              fVar329 = fVar341 * fVar341;
              fVar330 = fVar342 * fVar342;
              fVar343 = fVar439 + fVar331 * fVar331 + fVar329;
              fVar345 = fVar439 + fVar439 + fVar330;
              fVar329 = fVar439 + fVar329 + fVar329;
              fVar330 = fVar439 + fVar330 + fVar330;
              fVar439 = fVar434;
              if (fVar434 <= fVar315) {
                fVar439 = fVar315;
              }
              fVar392 = -local_4d8;
              fVar395 = -fStack_4d4;
              fVar397 = -fStack_4d0;
              fVar350 = fStack_4d4 * fStack_4d4 + local_4d8 * local_4d8 + fStack_4d0 * fStack_4d0;
              auVar333 = ZEXT416((uint)fVar350);
              auVar248 = rsqrtss(ZEXT416((uint)fVar350),auVar333);
              fVar315 = auVar248._0_4_;
              fVar353 = fVar315 * 1.5 - fVar315 * fVar315 * fVar350 * 0.5 * fVar315;
              fVar372 = local_4d8 * fVar353;
              fVar377 = fStack_4d4 * fVar353;
              fVar379 = fStack_4d0 * fVar353;
              fVar380 = fStack_4cc * fVar353;
              fVar370 = fStack_4d0 * fVar441 + fStack_4d4 * fVar314 + local_4d8 * fVar312;
              auVar333 = rcpss(auVar333,auVar333);
              fVar315 = (2.0 - fVar350 * auVar333._0_4_) * auVar333._0_4_;
              fVar364 = fVar332 * fVar377;
              fVar367 = fVar341 * fVar379;
              fVar369 = fVar342 * fVar380;
              fVar400 = fVar364 + fVar331 * fVar372 + fVar367;
              fVar405 = fVar364 + fVar364 + fVar369;
              fVar367 = fVar364 + fVar367 + fVar367;
              fVar369 = fVar364 + fVar369 + fVar369;
              fVar364 = (SQRT(fVar343) + 1.0) * (fVar434 / SQRT(fVar350)) +
                        SQRT(fVar343) * fVar434 + fVar439;
              fVar382 = fVar380 * -fStack_4cc;
              fVar314 = fVar379 * fVar397 + fVar377 * fVar395 + fVar372 * fVar392 +
                        fVar315 * (fVar350 * fVar441 - fVar370 * fStack_4d0) * fVar353 * fVar341 +
                        fVar315 * (fVar350 * fVar314 - fVar370 * fStack_4d4) * fVar353 * fVar332 +
                        fVar315 * (fVar350 * fVar312 - fVar370 * local_4d8) * fVar353 * fVar331;
              fVar350 = fVar399 * fVar379 + fVar394 * fVar377 + fVar391 * fVar372;
              fVar441 = fVar343 - fVar400 * fVar400;
              auVar415._0_8_ = CONCAT44(fVar345 - fVar405 * fVar405,fVar441);
              auVar415._8_4_ = fVar329 - fVar367 * fVar367;
              auVar415._12_4_ = fVar330 - fVar369 * fVar369;
              fVar315 = -fStack_4cc * fVar342;
              local_3b8 = CONCAT44(fVar382,fVar314);
              auVar226._8_4_ = auVar415._8_4_;
              auVar226._0_8_ = auVar415._0_8_;
              auVar226._12_4_ = auVar415._12_4_;
              auVar333 = rsqrtss(auVar226,auVar415);
              fVar312 = auVar333._0_4_;
              fVar312 = fVar312 * 1.5 - fVar312 * fVar312 * fVar441 * 0.5 * fVar312;
              if (fVar441 < 0.0) {
                fVar441 = sqrtf(fVar441);
                pRVar121 = extraout_RAX_00;
                pRVar126 = extraout_RDX_02;
              }
              else {
                fVar441 = SQRT(fVar441);
              }
              fVar441 = fVar441 - fVar352;
              fVar352 = ((fVar397 * fVar341 + fVar395 * fVar332 + fVar392 * fVar331) -
                        fVar400 * fVar314) * fVar312 - fStack_4cc;
              fVar312 = ((fVar399 * fVar341 + fVar394 * fVar332 + fVar391 * fVar331) -
                        fVar400 * fVar350) * fVar312;
              auVar292._0_4_ = fVar314 * fVar312 - fVar350 * fVar352;
              auVar310._8_4_ = -fVar315;
              auVar310._0_8_ = CONCAT44(fVar315,fVar352) ^ 0x8000000000000000;
              auVar310._12_4_ = fVar403 * fVar342;
              auVar309._8_8_ = auVar310._8_8_;
              auVar309._0_8_ = CONCAT44(fVar312,fVar352) ^ 0x80000000;
              auVar292._4_4_ = auVar292._0_4_;
              auVar292._8_4_ = auVar292._0_4_;
              auVar292._12_4_ = auVar292._0_4_;
              auVar333 = divps(auVar309,auVar292);
              auVar326._8_4_ = fVar382;
              auVar326._0_8_ = local_3b8;
              auVar326._12_4_ = -(fVar403 * fVar380);
              auVar325._8_8_ = auVar326._8_8_;
              auVar325._0_8_ = CONCAT44(fVar350,fVar314) ^ 0x8000000000000000;
              auVar248 = divps(auVar325,auVar292);
              fVar418 = fVar418 - (fVar441 * auVar248._0_4_ + fVar400 * auVar333._0_4_);
              fVar404 = fVar404 - (fVar441 * auVar248._4_4_ + fVar400 * auVar333._4_4_);
            } while ((fVar364 <= ABS(fVar400)) ||
                    (auVar356._12_4_ * 1.9073486e-06 + fVar439 + fVar364 <= ABS(fVar441)));
            fVar418 = local_328._0_4_ + fVar418;
            if (((ray->super_RayK<1>).org.field_0.m128[3] <= fVar418) &&
               (((fVar391 = (ray->super_RayK<1>).tfar, fVar418 <= fVar391 && (0.0 <= fVar404)) &&
                (fVar404 <= 1.0)))) {
              auVar76._4_4_ = fVar345;
              auVar76._0_4_ = fVar343;
              auVar76._8_4_ = fVar329;
              auVar76._12_4_ = fVar330;
              auVar333 = rsqrtss(auVar76,auVar76);
              fVar394 = auVar333._0_4_;
              pGVar26 = (context->scene->geometries).items[uVar132].ptr;
              uVar134 = (ray->super_RayK<1>).mask;
              pRVar121 = (RTCRayN *)(ulong)uVar134;
              if ((pGVar26->mask & uVar134) != 0) {
                fVar394 = fVar394 * 1.5 + fVar394 * fVar394 * fVar343 * -0.5 * fVar394;
                fVar331 = fVar331 * fVar394;
                fVar332 = fVar332 * fVar394;
                fVar341 = fVar341 * fVar394;
                fVar394 = fStack_4cc * fVar331 + local_4d8;
                fVar399 = fStack_4cc * fVar332 + fStack_4d4;
                fVar403 = fStack_4cc * fVar341 + fStack_4d0;
                fVar439 = fVar332 * local_4d8 - fStack_4d4 * fVar331;
                fVar441 = fVar341 * fStack_4d4 - fStack_4d0 * fVar332;
                fVar312 = fVar331 * fStack_4d0 - local_4d8 * fVar341;
                fVar434 = fVar399 * fVar441 - fVar312 * fVar394;
                uVar182 = CONCAT44(fVar394 * fVar439 - fVar441 * fVar403,
                                   fVar403 * fVar312 - fVar439 * fVar399);
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar26->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  (ray->super_RayK<1>).tfar = fVar418;
                  *(undefined8 *)&(ray->Ng).field_0 = uVar182;
                  (ray->Ng).field_0.field_0.z = fVar434;
                  ray->u = fVar404;
                  ray->v = 0.0;
                  ray->primID = uVar133;
                  ray->geomID = uVar132;
                  ray->instID[0] = context->user->instID[0];
                  uVar134 = context->user->instPrimID[0];
                  ray->instPrimID[0] = uVar134;
                  pRVar121 = (RTCRayN *)(ulong)uVar134;
                }
                else {
                  vu0.field_0._0_8_ = uVar182;
                  vu0.field_0.v[2] = fVar434;
                  vu0.field_0.v[3] = fVar404;
                  pRVar124 = (RTCIntersectArguments *)(ulong)context->user->instID[0];
                  (ray->super_RayK<1>).tfar = fVar418;
                  local_4fc = -1;
                  args.geometryUserPtr = pGVar26->userPtr;
                  args.valid = &local_4fc;
                  args.context = context->user;
                  args.hit = (RTCHitN *)&vu0;
                  args.N = 1;
                  args.ray = (RTCRayN *)ray;
                  if (pGVar26->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00357720:
                    pRVar124 = context->args;
                    if ((pRVar124->filter != (RTCFilterFunctionN)0x0) &&
                       (((pRVar124->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar26->field_8).field_0x2 & 0x40) != 0)))) {
                      (*pRVar124->filter)(&args);
                      pRVar126 = extraout_RDX_04;
                      if (*args.valid == 0) goto LAB_003577cd;
                    }
                    *(undefined4 *)(args.ray + 0x30) = *(undefined4 *)args.hit;
                    *(undefined4 *)(args.ray + 0x34) = *(undefined4 *)(args.hit + 4);
                    *(undefined4 *)(args.ray + 0x38) = *(undefined4 *)(args.hit + 8);
                    *(undefined4 *)(args.ray + 0x3c) = *(undefined4 *)(args.hit + 0xc);
                    *(undefined4 *)(args.ray + 0x40) = *(undefined4 *)(args.hit + 0x10);
                    *(undefined4 *)(args.ray + 0x44) = *(undefined4 *)(args.hit + 0x14);
                    *(undefined4 *)(args.ray + 0x48) = *(undefined4 *)(args.hit + 0x18);
                    pRVar126 = (RTCIntersectArguments *)(ulong)*(uint *)(args.hit + 0x1c);
                    *(uint *)(args.ray + 0x4c) = *(uint *)(args.hit + 0x1c);
                    pRVar124 = (RTCIntersectArguments *)(ulong)*(uint *)(args.hit + 0x20);
                    *(uint *)(args.ray + 0x50) = *(uint *)(args.hit + 0x20);
                    pRVar121 = args.ray;
                  }
                  else {
                    (*pGVar26->intersectionFilterN)(&args);
                    pRVar126 = extraout_RDX_03;
                    if (*args.valid != 0) goto LAB_00357720;
LAB_003577cd:
                    (ray->super_RayK<1>).tfar = fVar391;
                    pRVar121 = (RTCRayN *)args.valid;
                  }
                }
              }
            }
LAB_0035760c:
            fVar399 = (ray->super_RayK<1>).tfar;
            auVar225._0_4_ = -(uint)(fVar362 <= fVar399) & local_378._0_4_;
            auVar225._4_4_ = -(uint)(fVar363 <= fVar399) & local_378._4_4_;
            auVar225._8_4_ = -(uint)(fVar378 <= fVar399) & local_378._8_4_;
            auVar225._12_4_ = -(uint)(fVar381 <= fVar399) & local_378._12_4_;
          }
          auVar327._0_4_ =
               local_4f8._0_4_ & local_358._0_4_ & -(uint)(local_4e8 + fVar409 <= fVar399);
          auVar327._4_4_ =
               local_4f8._4_4_ & local_358._4_4_ & -(uint)(fStack_4e4 + fVar426 <= fVar399);
          auVar327._8_4_ =
               (uint)fStack_4f0 & (uint)fStack_350 & -(uint)(fStack_4e0 + fVar429 <= fVar399);
          auVar327._12_4_ =
               (uint)fStack_4ec & (uint)fStack_34c & -(uint)(fStack_4dc + fVar407 <= fVar399);
          auVar170._0_4_ =
               auVar224._0_4_ & auVar288._0_4_ &
               -(uint)(local_4e8 + tp1.lower.field_0.v[0] <= fVar399);
          auVar170._4_4_ =
               auVar224._4_4_ & auVar288._4_4_ &
               -(uint)(fStack_4e4 + tp1.lower.field_0.v[1] <= fVar399);
          auVar170._8_4_ =
               auVar224._8_4_ & auVar288._8_4_ &
               -(uint)(fStack_4e0 + tp1.lower.field_0.v[2] <= fVar399);
          auVar170._12_4_ =
               auVar224._12_4_ & auVar288._12_4_ &
               -(uint)(fStack_4dc + tp1.lower.field_0.v[3] <= fVar399);
          iVar257 = movmskps(0,auVar170 | auVar327);
          if (iVar257 != 0) {
            stack[(long)pRVar127].valid.field_0 =
                 (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)(auVar170 | auVar327);
            stack[(long)pRVar127].tlower.field_0.i[0] =
                 ~auVar327._0_4_ & tp1.lower.field_0.i[0] | (uint)fVar409 & auVar327._0_4_;
            stack[(long)pRVar127].tlower.field_0.i[1] =
                 ~auVar327._4_4_ & tp1.lower.field_0.i[1] | (uint)fVar426 & auVar327._4_4_;
            stack[(long)pRVar127].tlower.field_0.i[2] =
                 ~auVar327._8_4_ & tp1.lower.field_0.i[2] | (uint)fVar429 & auVar327._8_4_;
            stack[(long)pRVar127].tlower.field_0.i[3] =
                 ~auVar327._12_4_ & tp1.lower.field_0.i[3] | (uint)fVar407 & auVar327._12_4_;
            stack[(long)pRVar127].u0 = fVar406;
            stack[(long)pRVar127].u1 = fVar181;
            pRVar124 = (RTCIntersectArguments *)(ulong)((int)local_61c + 1U);
            stack[(long)pRVar127].depth = (int)local_61c + 1U;
            pRVar127 = (RTCIntersectArguments *)(ulong)((int)pRVar127 + 1);
          }
        }
      }
    }
    fVar406 = (ray->super_RayK<1>).tfar;
    pRVar125 = pRVar124;
    do {
      pRVar128 = pRVar127;
      iVar257 = (int)pRVar128;
      if (iVar257 == 0) {
        auVar172._4_4_ = -(uint)(fVar177 <= fVar406);
        auVar172._0_4_ = -(uint)(fVar140 <= fVar406);
        auVar172._8_4_ = -(uint)(fVar179 <= fVar406);
        auVar172._12_4_ = -(uint)(fVar180 <= fVar406);
        uVar132 = movmskps((int)pRVar125,auVar172);
        local_310 = (ulong)((uint)local_310 - 1 & (uint)local_310 & uVar132);
        goto LAB_003553c5;
      }
      pRVar125 = (RTCIntersectArguments *)(ulong)(iVar257 - 1U);
      fVar181 = stack[(long)pRVar125].tlower.field_0.v[0];
      fVar362 = stack[(long)pRVar125].tlower.field_0.v[1];
      fVar363 = stack[(long)pRVar125].tlower.field_0.v[2];
      fVar378 = stack[(long)pRVar125].tlower.field_0.v[3];
      args.valid._0_4_ =
           -(uint)(local_4e8 + fVar181 <= fVar406) & stack[(long)pRVar125].valid.field_0.i[0];
      args.valid._4_4_ =
           -(uint)(fStack_4e4 + fVar362 <= fVar406) & stack[(long)pRVar125].valid.field_0.i[1];
      args.geometryUserPtr._0_4_ =
           -(uint)(fStack_4e0 + fVar363 <= fVar406) & stack[(long)pRVar125].valid.field_0.i[2];
      args.geometryUserPtr._4_4_ =
           -(uint)(fStack_4dc + fVar378 <= fVar406) & stack[(long)pRVar125].valid.field_0.i[3];
      uVar134 = movmskps((int)pRVar126,(undefined1  [16])args._0_16_);
      pRVar126 = (RTCIntersectArguments *)(ulong)uVar134;
      pRVar127 = pRVar125;
    } while (uVar134 == 0);
    auVar255._0_4_ = (uint)fVar181 & (uint)args.valid;
    auVar255._4_4_ = (uint)fVar362 & args.valid._4_4_;
    auVar255._8_4_ = (uint)fVar363 & (uint)args.geometryUserPtr;
    auVar255._12_4_ = (uint)fVar378 & args.geometryUserPtr._4_4_;
    auVar293._0_8_ = CONCAT44(~args.valid._4_4_,~(uint)args.valid) & 0x7f8000007f800000;
    auVar293._8_4_ = ~(uint)args.geometryUserPtr & 0x7f800000;
    auVar293._12_4_ = ~args.geometryUserPtr._4_4_ & 0x7f800000;
    auVar293 = auVar293 | auVar255;
    auVar256._4_4_ = auVar293._0_4_;
    auVar256._0_4_ = auVar293._4_4_;
    auVar256._8_4_ = auVar293._12_4_;
    auVar256._12_4_ = auVar293._8_4_;
    auVar333 = minps(auVar256,auVar293);
    auVar227._0_8_ = auVar333._8_8_;
    auVar227._8_4_ = auVar333._0_4_;
    auVar227._12_4_ = auVar333._4_4_;
    auVar333 = minps(auVar227,auVar333);
    auVar228._0_8_ =
         CONCAT44(-(uint)(auVar333._4_4_ == auVar293._4_4_) & args.valid._4_4_,
                  -(uint)(auVar333._0_4_ == auVar293._0_4_) & (uint)args.valid);
    auVar228._8_4_ = -(uint)(auVar333._8_4_ == auVar293._8_4_) & (uint)args.geometryUserPtr;
    auVar228._12_4_ = -(uint)(auVar333._12_4_ == auVar293._12_4_) & args.geometryUserPtr._4_4_;
    iVar176 = movmskps(iVar257 - 1U,auVar228);
    auVar171 = (undefined1  [16])args._0_16_;
    if (iVar176 != 0) {
      auVar171._8_4_ = auVar228._8_4_;
      auVar171._0_8_ = auVar228._0_8_;
      auVar171._12_4_ = auVar228._12_4_;
    }
    pSVar120 = stack + (long)pRVar125;
    uVar134 = movmskps(iVar176,auVar171);
    pRVar124 = (RTCIntersectArguments *)0x0;
    if (uVar134 != 0) {
      for (; (uVar134 >> (long)pRVar124 & 1) == 0;
          pRVar124 = (RTCIntersectArguments *)((long)&pRVar124->flags + 1)) {
      }
    }
    *(undefined4 *)((long)&args.valid + (long)pRVar124 * 4) = 0;
    uVar10 = stack[(long)pRVar125].u0;
    uVar18 = stack[(long)pRVar125].u1;
    local_61c = (float)stack[(long)pRVar125].depth;
    iVar176 = movmskps(local_61c,(undefined1  [16])args._0_16_);
    pRVar126 = (RTCIntersectArguments *)(ulong)(iVar257 - 1);
    if (iVar176 != 0) {
      pRVar126 = pRVar128;
    }
    (pSVar120->valid).field_0 = (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)args._0_16_;
    fVar406 = (float)uVar18 - (float)uVar10;
    vu0.field_0.v[1] = fVar406 * 0.33333334 + (float)uVar10;
    vu0.field_0.v[0] = fVar406 * 0.0 + (float)uVar10;
    vu0.field_0.v[2] = fVar406 * 0.6666667 + (float)uVar10;
    vu0.field_0.v[3] = fVar406 * 1.0 + (float)uVar10;
    fVar406 = vu0.field_0.v[(long)pRVar124];
    fVar181 = *(float *)((long)&vu0.field_0 + (long)pRVar124 * 4 + 4);
    pRVar127 = pRVar126;
  } while( true );
}

Assistant:

static __forceinline void intersect_t(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time());

          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }